

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  __int_type_conflict _Var10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 uVar28;
  ulong uVar29;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  undefined1 auVar67 [32];
  Geometry *pGVar68;
  byte bVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar72;
  long lVar73;
  long lVar74;
  Geometry *pGVar75;
  uint uVar76;
  ulong uVar77;
  byte bVar78;
  ulong uVar79;
  float fVar80;
  float fVar81;
  float fVar133;
  float fVar135;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar134;
  float fVar136;
  float fVar138;
  float fVar139;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar92 [16];
  float fVar137;
  float fVar140;
  float fVar141;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar142;
  undefined4 uVar143;
  float fVar159;
  float fVar160;
  vint4 bi_2;
  float fVar161;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined8 uVar162;
  vint4 bi_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  float fVar168;
  float fVar169;
  float fVar181;
  vint4 bi;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  vint4 ai_2;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  vint4 ai_1;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar212 [64];
  vint4 ai;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  float fVar220;
  float fVar221;
  undefined1 auVar219 [16];
  float fVar222;
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar231 [32];
  undefined1 auVar235 [64];
  undefined1 auVar236 [16];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  RTCFilterFunctionNArguments args;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  RTCFilterFunctionNArguments local_660;
  Geometry *local_630;
  undefined1 (*local_628) [32];
  undefined1 local_620 [32];
  LinearSpace3fa *local_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined4 uStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  int local_39c;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar232 [32];
  
  PVar6 = prim[1];
  uVar70 = (ulong)(byte)PVar6;
  lVar30 = uVar70 * 0x25;
  fVar142 = *(float *)(prim + lVar30 + 0x12);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar82 = vsubps_avx(auVar82,*(undefined1 (*) [16])(prim + lVar30 + 6));
  auVar182._0_4_ = fVar142 * auVar82._0_4_;
  auVar182._4_4_ = fVar142 * auVar82._4_4_;
  auVar182._8_4_ = fVar142 * auVar82._8_4_;
  auVar182._12_4_ = fVar142 * auVar82._12_4_;
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar92._0_4_ = fVar142 * auVar83._0_4_;
  auVar92._4_4_ = fVar142 * auVar83._4_4_;
  auVar92._8_4_ = fVar142 * auVar83._8_4_;
  auVar92._12_4_ = fVar142 * auVar83._12_4_;
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xf + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar70 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1a + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1b + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1c + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar201._4_4_ = auVar92._0_4_;
  auVar201._0_4_ = auVar92._0_4_;
  auVar201._8_4_ = auVar92._0_4_;
  auVar201._12_4_ = auVar92._0_4_;
  auVar26 = vshufps_avx(auVar92,auVar92,0x55);
  auVar27 = vshufps_avx(auVar92,auVar92,0xaa);
  fVar142 = auVar27._0_4_;
  auVar170._0_4_ = fVar142 * auVar89._0_4_;
  fVar159 = auVar27._4_4_;
  auVar170._4_4_ = fVar159 * auVar89._4_4_;
  fVar160 = auVar27._8_4_;
  auVar170._8_4_ = fVar160 * auVar89._8_4_;
  fVar161 = auVar27._12_4_;
  auVar170._12_4_ = fVar161 * auVar89._12_4_;
  auVar163._0_4_ = auVar22._0_4_ * fVar142;
  auVar163._4_4_ = auVar22._4_4_ * fVar159;
  auVar163._8_4_ = auVar22._8_4_ * fVar160;
  auVar163._12_4_ = auVar22._12_4_ * fVar161;
  auVar144._0_4_ = auVar25._0_4_ * fVar142;
  auVar144._4_4_ = auVar25._4_4_ * fVar159;
  auVar144._8_4_ = auVar25._8_4_ * fVar160;
  auVar144._12_4_ = auVar25._12_4_ * fVar161;
  auVar27 = vfmadd231ps_fma(auVar170,auVar26,auVar83);
  auVar87 = vfmadd231ps_fma(auVar163,auVar26,auVar21);
  auVar26 = vfmadd231ps_fma(auVar144,auVar24,auVar26);
  auVar88 = vfmadd231ps_fma(auVar27,auVar201,auVar82);
  auVar87 = vfmadd231ps_fma(auVar87,auVar201,auVar20);
  auVar90 = vfmadd231ps_fma(auVar26,auVar23,auVar201);
  auVar229._4_4_ = auVar182._0_4_;
  auVar229._0_4_ = auVar182._0_4_;
  auVar229._8_4_ = auVar182._0_4_;
  auVar229._12_4_ = auVar182._0_4_;
  auVar26 = vshufps_avx(auVar182,auVar182,0x55);
  auVar27 = vshufps_avx(auVar182,auVar182,0xaa);
  fVar142 = auVar27._0_4_;
  auVar202._0_4_ = fVar142 * auVar89._0_4_;
  fVar159 = auVar27._4_4_;
  auVar202._4_4_ = fVar159 * auVar89._4_4_;
  fVar160 = auVar27._8_4_;
  auVar202._8_4_ = fVar160 * auVar89._8_4_;
  fVar161 = auVar27._12_4_;
  auVar202._12_4_ = fVar161 * auVar89._12_4_;
  auVar192._0_4_ = auVar22._0_4_ * fVar142;
  auVar192._4_4_ = auVar22._4_4_ * fVar159;
  auVar192._8_4_ = auVar22._8_4_ * fVar160;
  auVar192._12_4_ = auVar22._12_4_ * fVar161;
  auVar183._0_4_ = auVar25._0_4_ * fVar142;
  auVar183._4_4_ = auVar25._4_4_ * fVar159;
  auVar183._8_4_ = auVar25._8_4_ * fVar160;
  auVar183._12_4_ = auVar25._12_4_ * fVar161;
  auVar83 = vfmadd231ps_fma(auVar202,auVar26,auVar83);
  auVar89 = vfmadd231ps_fma(auVar192,auVar26,auVar21);
  auVar21 = vfmadd231ps_fma(auVar183,auVar26,auVar24);
  auVar91 = vfmadd231ps_fma(auVar83,auVar229,auVar82);
  auVar92 = vfmadd231ps_fma(auVar89,auVar229,auVar20);
  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar237 = ZEXT1664(auVar82);
  auVar144 = vfmadd231ps_fma(auVar21,auVar229,auVar23);
  auVar83 = vandps_avx512vl(auVar88,auVar82);
  auVar215._8_4_ = 0x219392ef;
  auVar215._0_8_ = 0x219392ef219392ef;
  auVar215._12_4_ = 0x219392ef;
  uVar77 = vcmpps_avx512vl(auVar83,auVar215,1);
  bVar13 = (bool)((byte)uVar77 & 1);
  auVar84._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar88._0_4_;
  bVar13 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar88._4_4_;
  bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar88._8_4_;
  bVar13 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar88._12_4_;
  auVar83 = vandps_avx512vl(auVar87,auVar82);
  uVar77 = vcmpps_avx512vl(auVar83,auVar215,1);
  bVar13 = (bool)((byte)uVar77 & 1);
  auVar85._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar87._0_4_;
  bVar13 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar87._4_4_;
  bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar87._8_4_;
  bVar13 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar87._12_4_;
  auVar82 = vandps_avx512vl(auVar90,auVar82);
  uVar77 = vcmpps_avx512vl(auVar82,auVar215,1);
  bVar13 = (bool)((byte)uVar77 & 1);
  auVar86._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._0_4_;
  bVar13 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._4_4_;
  bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._8_4_;
  bVar13 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._12_4_;
  auVar83 = vrcp14ps_avx512vl(auVar84);
  auVar216._8_4_ = 0x3f800000;
  auVar216._0_8_ = 0x3f8000003f800000;
  auVar216._12_4_ = 0x3f800000;
  auVar82 = vfnmadd213ps_fma(auVar84,auVar83,auVar216);
  auVar88 = vfmadd132ps_fma(auVar82,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar85);
  auVar82 = vfnmadd213ps_fma(auVar85,auVar83,auVar216);
  auVar90 = vfmadd132ps_fma(auVar82,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar86);
  auVar82 = vfnmadd213ps_fma(auVar86,auVar83,auVar216);
  auVar236 = vfmadd132ps_fma(auVar82,auVar83,auVar83);
  fVar142 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar30 + 0x16)) *
            *(float *)(prim + lVar30 + 0x1a);
  auVar213._4_4_ = fVar142;
  auVar213._0_4_ = fVar142;
  auVar213._8_4_ = fVar142;
  auVar213._12_4_ = fVar142;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar82 = vpmovsxwd_avx(auVar82);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar83 = vpmovsxwd_avx(auVar83);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar20 = vsubps_avx(auVar83,auVar82);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar83 = vpmovsxwd_avx(auVar89);
  auVar89 = vfmadd213ps_fma(auVar20,auVar213,auVar82);
  auVar82 = vcvtdq2ps_avx(auVar83);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar70 * 0xd + 6);
  auVar83 = vpmovsxwd_avx(auVar20);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar82);
  auVar20 = vfmadd213ps_fma(auVar83,auVar213,auVar82);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar70 * 0x12 + 6);
  auVar82 = vpmovsxwd_avx(auVar21);
  auVar82 = vcvtdq2ps_avx(auVar82);
  uVar77 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar70 * 2 + uVar77 + 6);
  auVar83 = vpmovsxwd_avx(auVar22);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar82);
  auVar21 = vfmadd213ps_fma(auVar83,auVar213,auVar82);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar77 + 6);
  auVar82 = vpmovsxwd_avx(auVar23);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar70 * 0x18 + 6);
  auVar83 = vpmovsxwd_avx(auVar24);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar82);
  auVar22 = vfmadd213ps_fma(auVar83,auVar213,auVar82);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar70 * 0x1d + 6);
  auVar82 = vpmovsxwd_avx(auVar25);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar70 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar83 = vpmovsxwd_avx(auVar26);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar82);
  auVar23 = vfmadd213ps_fma(auVar83,auVar213,auVar82);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar70) + 6);
  auVar82 = vpmovsxwd_avx(auVar27);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar70 * 0x23 + 6);
  auVar83 = vpmovsxwd_avx(auVar87);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar82);
  auVar83 = vfmadd213ps_fma(auVar83,auVar213,auVar82);
  auVar82 = vsubps_avx(auVar89,auVar91);
  auVar214._0_4_ = auVar88._0_4_ * auVar82._0_4_;
  auVar214._4_4_ = auVar88._4_4_ * auVar82._4_4_;
  auVar214._8_4_ = auVar88._8_4_ * auVar82._8_4_;
  auVar214._12_4_ = auVar88._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar20,auVar91);
  auVar171._0_4_ = auVar88._0_4_ * auVar82._0_4_;
  auVar171._4_4_ = auVar88._4_4_ * auVar82._4_4_;
  auVar171._8_4_ = auVar88._8_4_ * auVar82._8_4_;
  auVar171._12_4_ = auVar88._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar21,auVar92);
  auVar203._0_4_ = auVar90._0_4_ * auVar82._0_4_;
  auVar203._4_4_ = auVar90._4_4_ * auVar82._4_4_;
  auVar203._8_4_ = auVar90._8_4_ * auVar82._8_4_;
  auVar203._12_4_ = auVar90._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar22,auVar92);
  auVar164._0_4_ = auVar90._0_4_ * auVar82._0_4_;
  auVar164._4_4_ = auVar90._4_4_ * auVar82._4_4_;
  auVar164._8_4_ = auVar90._8_4_ * auVar82._8_4_;
  auVar164._12_4_ = auVar90._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar23,auVar144);
  auVar193._0_4_ = auVar236._0_4_ * auVar82._0_4_;
  auVar193._4_4_ = auVar236._4_4_ * auVar82._4_4_;
  auVar193._8_4_ = auVar236._8_4_ * auVar82._8_4_;
  auVar193._12_4_ = auVar236._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar83,auVar144);
  auVar145._0_4_ = auVar236._0_4_ * auVar82._0_4_;
  auVar145._4_4_ = auVar236._4_4_ * auVar82._4_4_;
  auVar145._8_4_ = auVar236._8_4_ * auVar82._8_4_;
  auVar145._12_4_ = auVar236._12_4_ * auVar82._12_4_;
  auVar82 = vpminsd_avx(auVar214,auVar171);
  auVar83 = vpminsd_avx(auVar203,auVar164);
  auVar82 = vmaxps_avx(auVar82,auVar83);
  auVar83 = vpminsd_avx(auVar193,auVar145);
  uVar143 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar88._4_4_ = uVar143;
  auVar88._0_4_ = uVar143;
  auVar88._8_4_ = uVar143;
  auVar88._12_4_ = uVar143;
  auVar83 = vmaxps_avx512vl(auVar83,auVar88);
  auVar82 = vmaxps_avx(auVar82,auVar83);
  auVar90._8_4_ = 0x3f7ffffa;
  auVar90._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar90._12_4_ = 0x3f7ffffa;
  local_2d0 = vmulps_avx512vl(auVar82,auVar90);
  auVar82 = vpmaxsd_avx(auVar214,auVar171);
  auVar83 = vpmaxsd_avx(auVar203,auVar164);
  auVar82 = vminps_avx(auVar82,auVar83);
  auVar83 = vpmaxsd_avx(auVar193,auVar145);
  uVar143 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar236._4_4_ = uVar143;
  auVar236._0_4_ = uVar143;
  auVar236._8_4_ = uVar143;
  auVar236._12_4_ = uVar143;
  auVar83 = vminps_avx512vl(auVar83,auVar236);
  auVar82 = vminps_avx(auVar82,auVar83);
  auVar91._8_4_ = 0x3f800003;
  auVar91._0_8_ = 0x3f8000033f800003;
  auVar91._12_4_ = 0x3f800003;
  auVar82 = vmulps_avx512vl(auVar82,auVar91);
  auVar83 = vpbroadcastd_avx512vl();
  uVar162 = vcmpps_avx512vl(local_2d0,auVar82,2);
  uVar77 = vpcmpgtd_avx512vl(auVar83,_DAT_01f7fcf0);
  uVar77 = ((byte)uVar162 & 0xf) & uVar77;
  if ((char)uVar77 != '\0') {
    local_5e8 = pre->ray_space + k;
    local_628 = (undefined1 (*) [32])&local_140;
    auVar238 = ZEXT464(0xbf800000);
    local_2c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      lVar30 = 0;
      for (uVar70 = uVar77; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      uVar76 = *(uint *)(prim + 2);
      uVar7 = *(uint *)(prim + lVar30 * 4 + 6);
      pGVar75 = (context->scene->geometries).items[uVar76].ptr;
      uVar70 = (ulong)*(uint *)(*(long *)&pGVar75->field_0x58 +
                               (ulong)uVar7 *
                               pGVar75[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar142 = (pGVar75->time_range).lower;
      fVar142 = pGVar75->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar142) /
                ((pGVar75->time_range).upper - fVar142));
      auVar82 = vroundss_avx(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142),9);
      auVar83 = vaddss_avx512f(ZEXT416((uint)pGVar75->fnumTimeSegments),auVar238._0_16_);
      auVar82 = vminss_avx(auVar82,auVar83);
      auVar82 = vmaxss_avx(ZEXT816(0) << 0x20,auVar82);
      fVar142 = fVar142 - auVar82._0_4_;
      _Var10 = pGVar75[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar74 = (long)(int)auVar82._0_4_ * 0x38;
      lVar30 = *(long *)(_Var10 + 0x10 + lVar74);
      lVar73 = *(long *)(_Var10 + 0x38 + lVar74);
      lVar11 = *(long *)(_Var10 + 0x48 + lVar74);
      auVar165._4_4_ = fVar142;
      auVar165._0_4_ = fVar142;
      auVar165._8_4_ = fVar142;
      auVar165._12_4_ = fVar142;
      pfVar3 = (float *)(lVar73 + uVar70 * lVar11);
      auVar219._0_4_ = fVar142 * *pfVar3;
      auVar219._4_4_ = fVar142 * pfVar3[1];
      auVar219._8_4_ = fVar142 * pfVar3[2];
      auVar219._12_4_ = fVar142 * pfVar3[3];
      pfVar3 = (float *)(lVar73 + (uVar70 + 1) * lVar11);
      auVar223._0_4_ = fVar142 * *pfVar3;
      auVar223._4_4_ = fVar142 * pfVar3[1];
      auVar223._8_4_ = fVar142 * pfVar3[2];
      auVar223._12_4_ = fVar142 * pfVar3[3];
      auVar82 = vmulps_avx512vl(auVar165,*(undefined1 (*) [16])(lVar73 + (uVar70 + 2) * lVar11));
      auVar83 = vmulps_avx512vl(auVar165,*(undefined1 (*) [16])(lVar73 + lVar11 * (uVar70 + 3)));
      lVar73 = *(long *)(_Var10 + lVar74);
      fVar142 = 1.0 - fVar142;
      auVar146._4_4_ = fVar142;
      auVar146._0_4_ = fVar142;
      auVar146._8_4_ = fVar142;
      auVar146._12_4_ = fVar142;
      auVar20 = vfmadd231ps_fma(auVar219,auVar146,*(undefined1 (*) [16])(lVar73 + lVar30 * uVar70));
      auVar21 = vfmadd231ps_fma(auVar223,auVar146,
                                *(undefined1 (*) [16])(lVar73 + lVar30 * (uVar70 + 1)));
      auVar87 = vfmadd231ps_avx512vl
                          (auVar82,auVar146,*(undefined1 (*) [16])(lVar73 + lVar30 * (uVar70 + 2)));
      auVar88 = vfmadd231ps_avx512vl
                          (auVar83,auVar146,*(undefined1 (*) [16])(lVar73 + lVar30 * (uVar70 + 3)));
      iVar8 = (int)pGVar75[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      lVar30 = (long)iVar8 * 0x44;
      auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar89 = vsubps_avx(auVar20,auVar82);
      uVar143 = auVar89._0_4_;
      auVar172._4_4_ = uVar143;
      auVar172._0_4_ = uVar143;
      auVar172._8_4_ = uVar143;
      auVar172._12_4_ = uVar143;
      auVar83 = vshufps_avx(auVar89,auVar89,0x55);
      aVar4 = (local_5e8->vx).field_0;
      aVar5 = (local_5e8->vy).field_0;
      fVar142 = (local_5e8->vz).field_0.m128[0];
      fVar159 = *(float *)((long)&(local_5e8->vz).field_0 + 4);
      fVar160 = *(float *)((long)&(local_5e8->vz).field_0 + 8);
      fVar161 = *(float *)((long)&(local_5e8->vz).field_0 + 0xc);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar226._0_4_ = fVar142 * auVar89._0_4_;
      auVar226._4_4_ = fVar159 * auVar89._4_4_;
      auVar226._8_4_ = fVar160 * auVar89._8_4_;
      auVar226._12_4_ = fVar161 * auVar89._12_4_;
      auVar83 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar5,auVar83);
      auVar22 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar172);
      auVar89 = vsubps_avx(auVar21,auVar82);
      uVar143 = auVar89._0_4_;
      auVar173._4_4_ = uVar143;
      auVar173._0_4_ = uVar143;
      auVar173._8_4_ = uVar143;
      auVar173._12_4_ = uVar143;
      auVar83 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar227._0_4_ = fVar142 * auVar89._0_4_;
      auVar227._4_4_ = fVar159 * auVar89._4_4_;
      auVar227._8_4_ = fVar160 * auVar89._8_4_;
      auVar227._12_4_ = fVar161 * auVar89._12_4_;
      auVar83 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar5,auVar83);
      auVar23 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar173);
      auVar89 = vsubps_avx512vl(auVar87,auVar82);
      uVar143 = auVar89._0_4_;
      auVar174._4_4_ = uVar143;
      auVar174._0_4_ = uVar143;
      auVar174._8_4_ = uVar143;
      auVar174._12_4_ = uVar143;
      auVar83 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar228._0_4_ = fVar142 * auVar89._0_4_;
      auVar228._4_4_ = fVar159 * auVar89._4_4_;
      auVar228._8_4_ = fVar160 * auVar89._8_4_;
      auVar228._12_4_ = fVar161 * auVar89._12_4_;
      auVar83 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar5,auVar83);
      auVar89 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar174);
      auVar83 = vsubps_avx512vl(auVar88,auVar82);
      uVar143 = auVar83._0_4_;
      auVar166._4_4_ = uVar143;
      auVar166._0_4_ = uVar143;
      auVar166._8_4_ = uVar143;
      auVar166._12_4_ = uVar143;
      auVar82 = vshufps_avx(auVar83,auVar83,0x55);
      auVar83 = vshufps_avx(auVar83,auVar83,0xaa);
      auVar230._0_4_ = fVar142 * auVar83._0_4_;
      auVar230._4_4_ = fVar159 * auVar83._4_4_;
      auVar230._8_4_ = fVar160 * auVar83._8_4_;
      auVar230._12_4_ = fVar161 * auVar83._12_4_;
      auVar82 = vfmadd231ps_fma(auVar230,(undefined1  [16])aVar5,auVar82);
      auVar24 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar4,auVar166);
      auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar30);
      uVar143 = auVar22._0_4_;
      local_420._4_4_ = uVar143;
      local_420._0_4_ = uVar143;
      local_420._8_4_ = uVar143;
      local_420._12_4_ = uVar143;
      local_420._16_4_ = uVar143;
      local_420._20_4_ = uVar143;
      local_420._24_4_ = uVar143;
      local_420._28_4_ = uVar143;
      auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x484);
      auVar93._8_4_ = 1;
      auVar93._0_8_ = 0x100000001;
      auVar93._12_4_ = 1;
      auVar93._16_4_ = 1;
      auVar93._20_4_ = 1;
      auVar93._24_4_ = 1;
      auVar93._28_4_ = 1;
      local_440 = vpermps_avx2(auVar93,ZEXT1632(auVar22));
      uVar143 = auVar23._0_4_;
      auVar184._4_4_ = uVar143;
      auVar184._0_4_ = uVar143;
      auVar184._8_4_ = uVar143;
      auVar184._12_4_ = uVar143;
      local_460._16_4_ = uVar143;
      local_460._0_16_ = auVar184;
      local_460._20_4_ = uVar143;
      local_460._24_4_ = uVar143;
      local_460._28_4_ = uVar143;
      local_480 = vpermps_avx512vl(auVar93,ZEXT1632(auVar23));
      auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x908);
      local_4a0 = vbroadcastss_avx512vl(auVar89);
      local_4c0 = vpermps_avx512vl(auVar93,ZEXT1632(auVar89));
      auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0xd8c);
      uVar143 = auVar24._0_4_;
      local_4e0._4_4_ = uVar143;
      local_4e0._0_4_ = uVar143;
      fStack_4d8 = (float)uVar143;
      fStack_4d4 = (float)uVar143;
      fStack_4d0 = (float)uVar143;
      fStack_4cc = (float)uVar143;
      fStack_4c8 = (float)uVar143;
      register0x0000139c = uVar143;
      _local_500 = vpermps_avx512vl(auVar93,ZEXT1632(auVar24));
      auVar93 = vmulps_avx512vl(_local_4e0,auVar105);
      auVar94 = vmulps_avx512vl(_local_500,auVar105);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar106,local_4a0);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar106,local_4c0);
      auVar82 = vfmadd231ps_fma(auVar93,auVar108,local_460);
      auVar95 = vfmadd231ps_avx512vl(auVar94,auVar108,local_480);
      auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar107,local_420);
      auVar212 = ZEXT3264(auVar96);
      auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar30);
      auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x484);
      auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x908);
      auVar97 = vfmadd231ps_avx512vl(auVar95,auVar107,local_440);
      auVar200 = ZEXT3264(auVar97);
      auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0xd8c);
      auVar98 = vmulps_avx512vl(_local_4e0,auVar95);
      auVar99 = vmulps_avx512vl(_local_500,auVar95);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar104,local_4a0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar104,local_4c0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_460);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,local_480);
      auVar25 = vfmadd231ps_fma(auVar98,auVar93,local_420);
      auVar217 = ZEXT1664(auVar25);
      auVar26 = vfmadd231ps_fma(auVar99,auVar93,local_440);
      auVar99 = vsubps_avx512vl(ZEXT1632(auVar25),auVar96);
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar26),auVar97);
      auVar98 = vmulps_avx512vl(auVar97,auVar99);
      auVar101 = vmulps_avx512vl(auVar96,auVar100);
      auVar98 = vsubps_avx512vl(auVar98,auVar101);
      auVar82 = vshufps_avx(auVar20,auVar20,0xff);
      uVar162 = auVar82._0_8_;
      local_80._8_8_ = uVar162;
      local_80._0_8_ = uVar162;
      local_80._16_8_ = uVar162;
      local_80._24_8_ = uVar162;
      auVar82 = vshufps_avx(auVar21,auVar21,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar82);
      auVar82 = vshufps_avx512vl(auVar87,auVar87,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar82);
      auVar82 = vshufps_avx512vl(auVar88,auVar88,0xff);
      uVar162 = auVar82._0_8_;
      local_e0._8_8_ = uVar162;
      local_e0._0_8_ = uVar162;
      local_e0._16_8_ = uVar162;
      local_e0._24_8_ = uVar162;
      auVar101 = vmulps_avx512vl(local_e0,auVar105);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar106,local_c0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,local_a0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,local_80);
      auVar102 = vmulps_avx512vl(local_e0,auVar95);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar104,local_c0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar94,local_a0);
      auVar27 = vfmadd231ps_fma(auVar102,auVar93,local_80);
      auVar102 = vmulps_avx512vl(auVar100,auVar100);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar99,auVar99);
      auVar103 = vmaxps_avx512vl(auVar101,ZEXT1632(auVar27));
      auVar103 = vmulps_avx512vl(auVar103,auVar103);
      auVar102 = vmulps_avx512vl(auVar103,auVar102);
      auVar98 = vmulps_avx512vl(auVar98,auVar98);
      uVar162 = vcmpps_avx512vl(auVar98,auVar102,2);
      auVar82 = vblendps_avx(auVar22,auVar20,8);
      auVar236 = auVar237._0_16_;
      auVar83 = vandps_avx512vl(auVar82,auVar236);
      auVar82 = vblendps_avx(auVar23,auVar21,8);
      auVar82 = vandps_avx512vl(auVar82,auVar236);
      auVar83 = vmaxps_avx(auVar83,auVar82);
      auVar82 = vblendps_avx(auVar89,auVar87,8);
      auVar90 = vandps_avx512vl(auVar82,auVar236);
      auVar82 = vblendps_avx(auVar24,auVar88,8);
      auVar82 = vandps_avx512vl(auVar82,auVar236);
      auVar82 = vmaxps_avx(auVar90,auVar82);
      auVar82 = vmaxps_avx(auVar83,auVar82);
      auVar83 = vmovshdup_avx(auVar82);
      auVar83 = vmaxss_avx(auVar83,auVar82);
      auVar82 = vshufpd_avx(auVar82,auVar82,1);
      auVar82 = vmaxss_avx(auVar82,auVar83);
      auVar83 = vcvtsi2ss_avx512f(auVar236,iVar8);
      local_580._0_16_ = auVar83;
      auVar103._0_4_ = auVar83._0_4_;
      auVar103._4_4_ = auVar103._0_4_;
      auVar103._8_4_ = auVar103._0_4_;
      auVar103._12_4_ = auVar103._0_4_;
      auVar103._16_4_ = auVar103._0_4_;
      auVar103._20_4_ = auVar103._0_4_;
      auVar103._24_4_ = auVar103._0_4_;
      auVar103._28_4_ = auVar103._0_4_;
      uVar28 = vcmpps_avx512vl(auVar103,_DAT_01faff40,0xe);
      bVar78 = (byte)uVar162 & (byte)uVar28;
      auVar82 = vmulss_avx512f(auVar82,SUB6416(ZEXT464(0x35000000),0));
      local_5c0._0_16_ = auVar82;
      auVar98 = local_5c0;
      auVar102._8_4_ = 2;
      auVar102._0_8_ = 0x200000002;
      auVar102._12_4_ = 2;
      auVar102._16_4_ = 2;
      auVar102._20_4_ = 2;
      auVar102._24_4_ = 2;
      auVar102._28_4_ = 2;
      local_240 = vpermps_avx2(auVar102,ZEXT1632(auVar22));
      local_260 = vpermps_avx2(auVar102,ZEXT1632(auVar23));
      local_280 = vpermps_avx2(auVar102,ZEXT1632(auVar89));
      local_2a0 = vpermps_avx2(auVar102,ZEXT1632(auVar24));
      local_560 = *(undefined4 *)(ray + k * 4 + 0x60);
      uStack_55c = 0;
      uStack_558 = 0;
      uStack_554 = 0;
      local_670 = auVar20._0_8_;
      uStack_668 = auVar20._8_8_;
      local_680 = auVar21._0_8_;
      uStack_678 = auVar21._8_8_;
      local_690 = auVar87._0_8_;
      uStack_688 = auVar87._8_8_;
      local_6a0._0_4_ = auVar88._0_4_;
      fVar142 = (float)local_6a0;
      local_6a0._4_4_ = auVar88._4_4_;
      fVar159 = local_6a0._4_4_;
      uStack_698._0_4_ = auVar88._8_4_;
      fVar160 = (float)uStack_698;
      uStack_698._4_4_ = auVar88._12_4_;
      fVar161 = uStack_698._4_4_;
      local_6a0 = auVar88._0_8_;
      uStack_698 = auVar88._8_8_;
      local_5c0 = auVar98;
      if (bVar78 != 0) {
        auVar95 = vmulps_avx512vl(local_2a0,auVar95);
        auVar104 = vfmadd213ps_avx512vl(auVar104,local_280,auVar95);
        auVar94 = vfmadd213ps_avx512vl(auVar94,local_260,auVar104);
        auVar95 = vfmadd213ps_avx512vl(auVar93,local_240,auVar94);
        auVar105 = vmulps_avx512vl(local_2a0,auVar105);
        auVar106 = vfmadd213ps_avx512vl(auVar106,local_280,auVar105);
        auVar94 = vfmadd213ps_avx512vl(auVar108,local_260,auVar106);
        auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1210);
        auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1694);
        auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1b18);
        auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1f9c);
        auVar98 = vfmadd213ps_avx512vl(auVar107,local_240,auVar94);
        auVar107 = vmulps_avx512vl(_local_4e0,auVar93);
        auVar94 = vmulps_avx512vl(_local_500,auVar93);
        auVar93 = vmulps_avx512vl(local_2a0,auVar93);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,local_4a0);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar105,local_4c0);
        auVar105 = vfmadd231ps_avx512vl(auVar93,local_280,auVar105);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar106,local_460);
        auVar93 = vfmadd231ps_avx512vl(auVar94,auVar106,local_480);
        auVar94 = vfmadd231ps_avx512vl(auVar105,local_260,auVar106);
        auVar83 = vfmadd231ps_fma(auVar107,auVar108,local_420);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar108,local_440);
        auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1210);
        auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1b18);
        auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1f9c);
        auVar94 = vfmadd231ps_avx512vl(auVar94,local_240,auVar108);
        auVar108 = vmulps_avx512vl(_local_4e0,auVar105);
        auVar104 = vmulps_avx512vl(_local_500,auVar105);
        auVar105 = vmulps_avx512vl(local_2a0,auVar105);
        auVar102 = vfmadd231ps_avx512vl(auVar108,auVar106,local_4a0);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar106,local_4c0);
        auVar106 = vfmadd231ps_avx512vl(auVar105,local_280,auVar106);
        auVar237 = ZEXT1664(auVar236);
        auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1694);
        auVar105 = vfmadd231ps_avx512vl(auVar102,auVar108,local_460);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar108,local_480);
        auVar108 = vfmadd231ps_avx512vl(auVar106,local_260,auVar108);
        auVar238 = ZEXT1664(auVar238._0_16_);
        auVar89 = vfmadd231ps_fma(auVar105,auVar107,local_420);
        auVar106 = vfmadd231ps_avx512vl(auVar104,auVar107,local_440);
        auVar105 = vfmadd231ps_avx512vl(auVar108,local_240,auVar107);
        auVar231._8_4_ = 0x7fffffff;
        auVar231._0_8_ = 0x7fffffff7fffffff;
        auVar231._12_4_ = 0x7fffffff;
        auVar231._16_4_ = 0x7fffffff;
        auVar231._20_4_ = 0x7fffffff;
        auVar231._24_4_ = 0x7fffffff;
        auVar231._28_4_ = 0x7fffffff;
        auVar107 = vandps_avx(ZEXT1632(auVar83),auVar231);
        auVar108 = vandps_avx(auVar93,auVar231);
        auVar108 = vmaxps_avx(auVar107,auVar108);
        auVar107 = vandps_avx(auVar94,auVar231);
        auVar107 = vmaxps_avx(auVar108,auVar107);
        local_5c0._0_4_ = auVar82._0_4_;
        auVar224._4_4_ = local_5c0._0_4_;
        auVar224._0_4_ = local_5c0._0_4_;
        auVar224._8_4_ = local_5c0._0_4_;
        auVar224._12_4_ = local_5c0._0_4_;
        auVar224._16_4_ = local_5c0._0_4_;
        auVar224._20_4_ = local_5c0._0_4_;
        auVar224._24_4_ = local_5c0._0_4_;
        auVar224._28_4_ = local_5c0._0_4_;
        uVar70 = vcmpps_avx512vl(auVar107,auVar224,1);
        bVar13 = (bool)((byte)uVar70 & 1);
        auVar109._0_4_ = (float)((uint)bVar13 * auVar99._0_4_ | (uint)!bVar13 * auVar83._0_4_);
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar83._4_4_);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar83._8_4_);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar83._12_4_);
        fVar220 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar99._16_4_);
        auVar109._16_4_ = fVar220;
        fVar169 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar99._20_4_);
        auVar109._20_4_ = fVar169;
        fVar221 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar99._24_4_);
        auVar109._24_4_ = fVar221;
        auVar109._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar99._28_4_;
        bVar13 = (bool)((byte)uVar70 & 1);
        auVar110._0_4_ = (float)((uint)bVar13 * auVar100._0_4_ | (uint)!bVar13 * auVar93._0_4_);
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar93._4_4_);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar93._8_4_);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar93._12_4_);
        bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar13 * auVar100._16_4_ | (uint)!bVar13 * auVar93._16_4_);
        bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar13 * auVar100._20_4_ | (uint)!bVar13 * auVar93._20_4_);
        bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar13 * auVar100._24_4_ | (uint)!bVar13 * auVar93._24_4_);
        bVar13 = SUB81(uVar70 >> 7,0);
        auVar110._28_4_ = (uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar93._28_4_;
        auVar107 = vandps_avx(auVar231,ZEXT1632(auVar89));
        auVar108 = vandps_avx(auVar106,auVar231);
        auVar108 = vmaxps_avx(auVar107,auVar108);
        auVar107 = vandps_avx(auVar105,auVar231);
        auVar107 = vmaxps_avx(auVar108,auVar107);
        uVar70 = vcmpps_avx512vl(auVar107,auVar224,1);
        bVar13 = (bool)((byte)uVar70 & 1);
        auVar111._0_4_ = (float)((uint)bVar13 * auVar99._0_4_ | (uint)!bVar13 * auVar89._0_4_);
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar89._4_4_);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar89._8_4_);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar89._12_4_);
        fVar222 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar99._16_4_);
        auVar111._16_4_ = fVar222;
        fVar168 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar99._20_4_);
        auVar111._20_4_ = fVar168;
        fVar181 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar99._24_4_);
        auVar111._24_4_ = fVar181;
        uVar71 = (uint)(byte)(uVar70 >> 7) * auVar99._28_4_;
        auVar111._28_4_ = uVar71;
        bVar13 = (bool)((byte)uVar70 & 1);
        auVar112._0_4_ = (float)((uint)bVar13 * auVar100._0_4_ | (uint)!bVar13 * auVar106._0_4_);
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar106._4_4_);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar106._8_4_);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar106._12_4_);
        bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar112._16_4_ = (float)((uint)bVar13 * auVar100._16_4_ | (uint)!bVar13 * auVar106._16_4_);
        bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar112._20_4_ = (float)((uint)bVar13 * auVar100._20_4_ | (uint)!bVar13 * auVar106._20_4_);
        bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar112._24_4_ = (float)((uint)bVar13 * auVar100._24_4_ | (uint)!bVar13 * auVar106._24_4_);
        bVar13 = SUB81(uVar70 >> 7,0);
        auVar112._28_4_ = (uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar106._28_4_;
        auVar91 = vxorps_avx512vl(auVar184,auVar184);
        auVar107 = vfmadd213ps_avx512vl(auVar109,auVar109,ZEXT1632(auVar91));
        auVar82 = vfmadd231ps_fma(auVar107,auVar110,auVar110);
        auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
        fVar80 = auVar108._0_4_;
        fVar81 = auVar108._4_4_;
        fVar133 = auVar108._8_4_;
        fVar134 = auVar108._12_4_;
        fVar135 = auVar108._16_4_;
        fVar136 = auVar108._20_4_;
        fVar138 = auVar108._24_4_;
        auVar107._4_4_ = fVar81 * fVar81 * fVar81 * auVar82._4_4_ * -0.5;
        auVar107._0_4_ = fVar80 * fVar80 * fVar80 * auVar82._0_4_ * -0.5;
        auVar107._8_4_ = fVar133 * fVar133 * fVar133 * auVar82._8_4_ * -0.5;
        auVar107._12_4_ = fVar134 * fVar134 * fVar134 * auVar82._12_4_ * -0.5;
        auVar107._16_4_ = fVar135 * fVar135 * fVar135 * -0.0;
        auVar107._20_4_ = fVar136 * fVar136 * fVar136 * -0.0;
        auVar107._24_4_ = fVar138 * fVar138 * fVar138 * -0.0;
        auVar107._28_4_ = auVar105._28_4_;
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar93,auVar108);
        auVar108._4_4_ = auVar110._4_4_ * auVar107._4_4_;
        auVar108._0_4_ = auVar110._0_4_ * auVar107._0_4_;
        auVar108._8_4_ = auVar110._8_4_ * auVar107._8_4_;
        auVar108._12_4_ = auVar110._12_4_ * auVar107._12_4_;
        auVar108._16_4_ = auVar110._16_4_ * auVar107._16_4_;
        auVar108._20_4_ = auVar110._20_4_ * auVar107._20_4_;
        auVar108._24_4_ = auVar110._24_4_ * auVar107._24_4_;
        auVar108._28_4_ = 0;
        auVar106._4_4_ = auVar107._4_4_ * -auVar109._4_4_;
        auVar106._0_4_ = auVar107._0_4_ * -auVar109._0_4_;
        auVar106._8_4_ = auVar107._8_4_ * -auVar109._8_4_;
        auVar106._12_4_ = auVar107._12_4_ * -auVar109._12_4_;
        auVar106._16_4_ = auVar107._16_4_ * -fVar220;
        auVar106._20_4_ = auVar107._20_4_ * -fVar169;
        auVar106._24_4_ = auVar107._24_4_ * -fVar221;
        auVar106._28_4_ = auVar110._28_4_;
        auVar107 = vmulps_avx512vl(auVar107,ZEXT1632(auVar91));
        auVar100 = ZEXT1632(auVar91);
        auVar105 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar100);
        auVar82 = vfmadd231ps_fma(auVar105,auVar112,auVar112);
        auVar104 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
        fVar169 = auVar104._0_4_;
        fVar220 = auVar104._4_4_;
        fVar221 = auVar104._8_4_;
        fVar80 = auVar104._12_4_;
        fVar81 = auVar104._16_4_;
        fVar133 = auVar104._20_4_;
        fVar134 = auVar104._24_4_;
        auVar105._4_4_ = fVar220 * fVar220 * fVar220 * auVar82._4_4_ * -0.5;
        auVar105._0_4_ = fVar169 * fVar169 * fVar169 * auVar82._0_4_ * -0.5;
        auVar105._8_4_ = fVar221 * fVar221 * fVar221 * auVar82._8_4_ * -0.5;
        auVar105._12_4_ = fVar80 * fVar80 * fVar80 * auVar82._12_4_ * -0.5;
        auVar105._16_4_ = fVar81 * fVar81 * fVar81 * -0.0;
        auVar105._20_4_ = fVar133 * fVar133 * fVar133 * -0.0;
        auVar105._24_4_ = fVar134 * fVar134 * fVar134 * -0.0;
        auVar105._28_4_ = 0;
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar93,auVar104);
        auVar94._4_4_ = auVar112._4_4_ * auVar105._4_4_;
        auVar94._0_4_ = auVar112._0_4_ * auVar105._0_4_;
        auVar94._8_4_ = auVar112._8_4_ * auVar105._8_4_;
        auVar94._12_4_ = auVar112._12_4_ * auVar105._12_4_;
        auVar94._16_4_ = auVar112._16_4_ * auVar105._16_4_;
        auVar94._20_4_ = auVar112._20_4_ * auVar105._20_4_;
        auVar94._24_4_ = auVar112._24_4_ * auVar105._24_4_;
        auVar94._28_4_ = auVar104._28_4_;
        auVar104._4_4_ = -auVar111._4_4_ * auVar105._4_4_;
        auVar104._0_4_ = -auVar111._0_4_ * auVar105._0_4_;
        auVar104._8_4_ = -auVar111._8_4_ * auVar105._8_4_;
        auVar104._12_4_ = -auVar111._12_4_ * auVar105._12_4_;
        auVar104._16_4_ = -fVar222 * auVar105._16_4_;
        auVar104._20_4_ = -fVar168 * auVar105._20_4_;
        auVar104._24_4_ = -fVar181 * auVar105._24_4_;
        auVar104._28_4_ = uVar71 ^ 0x80000000;
        auVar105 = vmulps_avx512vl(auVar105,auVar100);
        auVar82 = vfmadd213ps_fma(auVar108,auVar101,auVar96);
        auVar83 = vfmadd213ps_fma(auVar106,auVar101,auVar97);
        auVar93 = vfmadd213ps_avx512vl(auVar107,auVar101,auVar98);
        auVar99 = vfmadd213ps_avx512vl(auVar94,ZEXT1632(auVar27),ZEXT1632(auVar25));
        auVar88 = vfnmadd213ps_fma(auVar108,auVar101,auVar96);
        auVar96 = ZEXT1632(auVar27);
        auVar89 = vfmadd213ps_fma(auVar104,auVar96,ZEXT1632(auVar26));
        auVar90 = vfnmadd213ps_fma(auVar106,auVar101,auVar97);
        auVar22 = vfmadd213ps_fma(auVar105,auVar96,auVar95);
        auVar108 = vfnmadd231ps_avx512vl(auVar98,auVar101,auVar107);
        auVar25 = vfnmadd213ps_fma(auVar94,auVar96,ZEXT1632(auVar25));
        auVar26 = vfnmadd213ps_fma(auVar104,auVar96,ZEXT1632(auVar26));
        auVar236 = vfnmadd231ps_fma(auVar95,ZEXT1632(auVar27),auVar105);
        auVar106 = vsubps_avx512vl(auVar99,ZEXT1632(auVar88));
        auVar107 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar90));
        auVar105 = vsubps_avx512vl(ZEXT1632(auVar22),auVar108);
        auVar94 = vmulps_avx512vl(auVar107,auVar108);
        auVar23 = vfmsub231ps_fma(auVar94,ZEXT1632(auVar90),auVar105);
        auVar95._4_4_ = auVar88._4_4_ * auVar105._4_4_;
        auVar95._0_4_ = auVar88._0_4_ * auVar105._0_4_;
        auVar95._8_4_ = auVar88._8_4_ * auVar105._8_4_;
        auVar95._12_4_ = auVar88._12_4_ * auVar105._12_4_;
        auVar95._16_4_ = auVar105._16_4_ * 0.0;
        auVar95._20_4_ = auVar105._20_4_ * 0.0;
        auVar95._24_4_ = auVar105._24_4_ * 0.0;
        auVar95._28_4_ = auVar105._28_4_;
        auVar105 = vfmsub231ps_avx512vl(auVar95,auVar108,auVar106);
        auVar98._4_4_ = auVar90._4_4_ * auVar106._4_4_;
        auVar98._0_4_ = auVar90._0_4_ * auVar106._0_4_;
        auVar98._8_4_ = auVar90._8_4_ * auVar106._8_4_;
        auVar98._12_4_ = auVar90._12_4_ * auVar106._12_4_;
        auVar98._16_4_ = auVar106._16_4_ * 0.0;
        auVar98._20_4_ = auVar106._20_4_ * 0.0;
        auVar98._24_4_ = auVar106._24_4_ * 0.0;
        auVar98._28_4_ = auVar106._28_4_;
        auVar24 = vfmsub231ps_fma(auVar98,ZEXT1632(auVar88),auVar107);
        auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar24),auVar100,auVar105);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar100,ZEXT1632(auVar23));
        auVar102 = ZEXT1632(auVar91);
        uVar70 = vcmpps_avx512vl(auVar107,auVar102,2);
        bVar69 = (byte)uVar70;
        fVar80 = (float)((uint)(bVar69 & 1) * auVar82._0_4_ |
                        (uint)!(bool)(bVar69 & 1) * auVar25._0_4_);
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        fVar133 = (float)((uint)bVar13 * auVar82._4_4_ | (uint)!bVar13 * auVar25._4_4_);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        fVar135 = (float)((uint)bVar13 * auVar82._8_4_ | (uint)!bVar13 * auVar25._8_4_);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        fVar138 = (float)((uint)bVar13 * auVar82._12_4_ | (uint)!bVar13 * auVar25._12_4_);
        auVar104 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar135,CONCAT44(fVar133,fVar80))));
        fVar81 = (float)((uint)(bVar69 & 1) * auVar83._0_4_ |
                        (uint)!(bool)(bVar69 & 1) * auVar26._0_4_);
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        fVar134 = (float)((uint)bVar13 * auVar83._4_4_ | (uint)!bVar13 * auVar26._4_4_);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        fVar136 = (float)((uint)bVar13 * auVar83._8_4_ | (uint)!bVar13 * auVar26._8_4_);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        fVar139 = (float)((uint)bVar13 * auVar83._12_4_ | (uint)!bVar13 * auVar26._12_4_);
        auVar95 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar136,CONCAT44(fVar134,fVar81))));
        auVar100._0_4_ =
             (float)((uint)(bVar69 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar236._0_4_
                    );
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar100._4_4_ = (float)((uint)bVar13 * auVar93._4_4_ | (uint)!bVar13 * auVar236._4_4_);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar100._8_4_ = (float)((uint)bVar13 * auVar93._8_4_ | (uint)!bVar13 * auVar236._8_4_);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar100._12_4_ = (float)((uint)bVar13 * auVar93._12_4_ | (uint)!bVar13 * auVar236._12_4_);
        fVar169 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar93._16_4_);
        auVar100._16_4_ = fVar169;
        fVar221 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar93._20_4_);
        auVar100._20_4_ = fVar221;
        fVar220 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar93._24_4_);
        auVar100._24_4_ = fVar220;
        iVar1 = (uint)(byte)(uVar70 >> 7) * auVar93._28_4_;
        auVar100._28_4_ = iVar1;
        auVar106 = vblendmps_avx512vl(ZEXT1632(auVar88),auVar99);
        auVar113._0_4_ =
             (uint)(bVar69 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar23._0_4_;
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar113._4_4_ = (uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar23._4_4_;
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar113._8_4_ = (uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar23._8_4_;
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar113._12_4_ = (uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar23._12_4_;
        auVar113._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar106._16_4_;
        auVar113._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar106._20_4_;
        auVar113._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar106._24_4_;
        auVar113._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar106._28_4_;
        auVar106 = vblendmps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar89));
        auVar114._0_4_ =
             (float)((uint)(bVar69 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar83._0_4_
                    );
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar83._4_4_);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar83._8_4_);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar83._12_4_);
        fVar181 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar106._16_4_);
        auVar114._16_4_ = fVar181;
        fVar168 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar106._20_4_);
        auVar114._20_4_ = fVar168;
        fVar222 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar106._24_4_);
        auVar114._24_4_ = fVar222;
        auVar114._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar106._28_4_;
        auVar106 = vblendmps_avx512vl(auVar108,ZEXT1632(auVar22));
        auVar115._0_4_ =
             (float)((uint)(bVar69 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar93._0_4_
                    );
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar93._4_4_);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar93._8_4_);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar93._12_4_);
        bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar13 * auVar106._16_4_ | (uint)!bVar13 * auVar93._16_4_);
        bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar13 * auVar106._20_4_ | (uint)!bVar13 * auVar93._20_4_);
        bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar13 * auVar106._24_4_ | (uint)!bVar13 * auVar93._24_4_);
        bVar13 = SUB81(uVar70 >> 7,0);
        auVar115._28_4_ = (uint)bVar13 * auVar106._28_4_ | (uint)!bVar13 * auVar93._28_4_;
        auVar116._0_4_ =
             (uint)(bVar69 & 1) * (int)auVar88._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar99._0_4_;
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar13 * (int)auVar88._4_4_ | (uint)!bVar13 * auVar99._4_4_;
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar13 * (int)auVar88._8_4_ | (uint)!bVar13 * auVar99._8_4_;
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar13 * (int)auVar88._12_4_ | (uint)!bVar13 * auVar99._12_4_;
        auVar116._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar99._16_4_;
        auVar116._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar99._20_4_;
        auVar116._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar99._24_4_;
        auVar116._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar99._28_4_;
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar117._0_4_ =
             (uint)(bVar69 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar22._0_4_;
        bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * auVar22._4_4_;
        bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * auVar22._8_4_;
        bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * auVar22._12_4_;
        auVar117._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar108._16_4_;
        auVar117._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar108._20_4_;
        auVar117._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar108._24_4_;
        iVar2 = (uint)(byte)(uVar70 >> 7) * auVar108._28_4_;
        auVar117._28_4_ = iVar2;
        auVar98 = vsubps_avx512vl(auVar116,auVar104);
        auVar108 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar90._12_4_ |
                                                 (uint)!bVar16 * auVar89._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar90._8_4_ |
                                                          (uint)!bVar15 * auVar89._8_4_,
                                                          CONCAT44((uint)bVar13 * (int)auVar90._4_4_
                                                                   | (uint)!bVar13 * auVar89._4_4_,
                                                                   (uint)(bVar69 & 1) *
                                                                   (int)auVar90._0_4_ |
                                                                   (uint)!(bool)(bVar69 & 1) *
                                                                   auVar89._0_4_)))),auVar95);
        auVar212 = ZEXT3264(auVar108);
        auVar106 = vsubps_avx(auVar117,auVar100);
        auVar105 = vsubps_avx(auVar104,auVar113);
        auVar217 = ZEXT3264(auVar105);
        auVar93 = vsubps_avx(auVar95,auVar114);
        auVar94 = vsubps_avx(auVar100,auVar115);
        auVar96._4_4_ = auVar106._4_4_ * fVar133;
        auVar96._0_4_ = auVar106._0_4_ * fVar80;
        auVar96._8_4_ = auVar106._8_4_ * fVar135;
        auVar96._12_4_ = auVar106._12_4_ * fVar138;
        auVar96._16_4_ = auVar106._16_4_ * 0.0;
        auVar96._20_4_ = auVar106._20_4_ * 0.0;
        auVar96._24_4_ = auVar106._24_4_ * 0.0;
        auVar96._28_4_ = iVar2;
        auVar82 = vfmsub231ps_fma(auVar96,auVar100,auVar98);
        auVar97._4_4_ = fVar134 * auVar98._4_4_;
        auVar97._0_4_ = fVar81 * auVar98._0_4_;
        auVar97._8_4_ = fVar136 * auVar98._8_4_;
        auVar97._12_4_ = fVar139 * auVar98._12_4_;
        auVar97._16_4_ = auVar98._16_4_ * 0.0;
        auVar97._20_4_ = auVar98._20_4_ * 0.0;
        auVar97._24_4_ = auVar98._24_4_ * 0.0;
        auVar97._28_4_ = auVar107._28_4_;
        auVar83 = vfmsub231ps_fma(auVar97,auVar104,auVar108);
        auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar102,ZEXT1632(auVar82));
        auVar194._0_4_ = auVar108._0_4_ * auVar100._0_4_;
        auVar194._4_4_ = auVar108._4_4_ * auVar100._4_4_;
        auVar194._8_4_ = auVar108._8_4_ * auVar100._8_4_;
        auVar194._12_4_ = auVar108._12_4_ * auVar100._12_4_;
        auVar194._16_4_ = auVar108._16_4_ * fVar169;
        auVar194._20_4_ = auVar108._20_4_ * fVar221;
        auVar194._24_4_ = auVar108._24_4_ * fVar220;
        auVar194._28_4_ = 0;
        auVar82 = vfmsub231ps_fma(auVar194,auVar95,auVar106);
        auVar96 = vfmadd231ps_avx512vl(auVar107,auVar102,ZEXT1632(auVar82));
        auVar107 = vmulps_avx512vl(auVar94,auVar113);
        auVar107 = vfmsub231ps_avx512vl(auVar107,auVar105,auVar115);
        auVar99._4_4_ = auVar93._4_4_ * auVar115._4_4_;
        auVar99._0_4_ = auVar93._0_4_ * auVar115._0_4_;
        auVar99._8_4_ = auVar93._8_4_ * auVar115._8_4_;
        auVar99._12_4_ = auVar93._12_4_ * auVar115._12_4_;
        auVar99._16_4_ = auVar93._16_4_ * auVar115._16_4_;
        auVar99._20_4_ = auVar93._20_4_ * auVar115._20_4_;
        auVar99._24_4_ = auVar93._24_4_ * auVar115._24_4_;
        auVar99._28_4_ = auVar115._28_4_;
        auVar82 = vfmsub231ps_fma(auVar99,auVar114,auVar94);
        auVar195._0_4_ = auVar114._0_4_ * auVar105._0_4_;
        auVar195._4_4_ = auVar114._4_4_ * auVar105._4_4_;
        auVar195._8_4_ = auVar114._8_4_ * auVar105._8_4_;
        auVar195._12_4_ = auVar114._12_4_ * auVar105._12_4_;
        auVar195._16_4_ = fVar181 * auVar105._16_4_;
        auVar195._20_4_ = fVar168 * auVar105._20_4_;
        auVar195._24_4_ = fVar222 * auVar105._24_4_;
        auVar195._28_4_ = 0;
        auVar83 = vfmsub231ps_fma(auVar195,auVar93,auVar113);
        auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar102,auVar107);
        auVar97 = vfmadd231ps_avx512vl(auVar107,auVar102,ZEXT1632(auVar82));
        auVar200 = ZEXT3264(auVar97);
        auVar107 = vmaxps_avx(auVar96,auVar97);
        uVar162 = vcmpps_avx512vl(auVar107,auVar102,2);
        bVar78 = bVar78 & (byte)uVar162;
        if (bVar78 != 0) {
          uVar143 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar232._4_4_ = uVar143;
          auVar232._0_4_ = uVar143;
          auVar232._8_4_ = uVar143;
          auVar232._12_4_ = uVar143;
          auVar232._16_4_ = uVar143;
          auVar232._20_4_ = uVar143;
          auVar232._24_4_ = uVar143;
          auVar232._28_4_ = uVar143;
          auVar235 = ZEXT3264(auVar232);
          auVar37._4_4_ = auVar94._4_4_ * auVar108._4_4_;
          auVar37._0_4_ = auVar94._0_4_ * auVar108._0_4_;
          auVar37._8_4_ = auVar94._8_4_ * auVar108._8_4_;
          auVar37._12_4_ = auVar94._12_4_ * auVar108._12_4_;
          auVar37._16_4_ = auVar94._16_4_ * auVar108._16_4_;
          auVar37._20_4_ = auVar94._20_4_ * auVar108._20_4_;
          auVar37._24_4_ = auVar94._24_4_ * auVar108._24_4_;
          auVar37._28_4_ = auVar107._28_4_;
          auVar22 = vfmsub231ps_fma(auVar37,auVar93,auVar106);
          auVar38._4_4_ = auVar106._4_4_ * auVar105._4_4_;
          auVar38._0_4_ = auVar106._0_4_ * auVar105._0_4_;
          auVar38._8_4_ = auVar106._8_4_ * auVar105._8_4_;
          auVar38._12_4_ = auVar106._12_4_ * auVar105._12_4_;
          auVar38._16_4_ = auVar106._16_4_ * auVar105._16_4_;
          auVar38._20_4_ = auVar106._20_4_ * auVar105._20_4_;
          auVar38._24_4_ = auVar106._24_4_ * auVar105._24_4_;
          auVar38._28_4_ = auVar106._28_4_;
          auVar89 = vfmsub231ps_fma(auVar38,auVar98,auVar94);
          auVar39._4_4_ = auVar93._4_4_ * auVar98._4_4_;
          auVar39._0_4_ = auVar93._0_4_ * auVar98._0_4_;
          auVar39._8_4_ = auVar93._8_4_ * auVar98._8_4_;
          auVar39._12_4_ = auVar93._12_4_ * auVar98._12_4_;
          auVar39._16_4_ = auVar93._16_4_ * auVar98._16_4_;
          auVar39._20_4_ = auVar93._20_4_ * auVar98._20_4_;
          auVar39._24_4_ = auVar93._24_4_ * auVar98._24_4_;
          auVar39._28_4_ = auVar93._28_4_;
          auVar23 = vfmsub231ps_fma(auVar39,auVar105,auVar108);
          auVar82 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar23));
          auVar83 = vfmadd231ps_fma(ZEXT1632(auVar82),ZEXT1632(auVar22),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar107 = vrcp14ps_avx512vl(ZEXT1632(auVar83));
          auVar32._8_4_ = 0x3f800000;
          auVar32._0_8_ = 0x3f8000003f800000;
          auVar32._12_4_ = 0x3f800000;
          auVar32._16_4_ = 0x3f800000;
          auVar32._20_4_ = 0x3f800000;
          auVar32._24_4_ = 0x3f800000;
          auVar32._28_4_ = 0x3f800000;
          auVar108 = vfnmadd213ps_avx512vl(auVar107,ZEXT1632(auVar83),auVar32);
          auVar82 = vfmadd132ps_fma(auVar108,auVar107,auVar107);
          auVar212 = ZEXT1664(auVar82);
          auVar40._4_4_ = auVar23._4_4_ * auVar100._4_4_;
          auVar40._0_4_ = auVar23._0_4_ * auVar100._0_4_;
          auVar40._8_4_ = auVar23._8_4_ * auVar100._8_4_;
          auVar40._12_4_ = auVar23._12_4_ * auVar100._12_4_;
          auVar40._16_4_ = fVar169 * 0.0;
          auVar40._20_4_ = fVar221 * 0.0;
          auVar40._24_4_ = fVar220 * 0.0;
          auVar40._28_4_ = iVar1;
          auVar89 = vfmadd231ps_fma(auVar40,auVar95,ZEXT1632(auVar89));
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar104,ZEXT1632(auVar22));
          fVar169 = auVar82._0_4_;
          fVar220 = auVar82._4_4_;
          fVar221 = auVar82._8_4_;
          fVar222 = auVar82._12_4_;
          local_5e0._28_4_ = auVar107._28_4_;
          local_5e0._0_28_ =
               ZEXT1628(CONCAT412(auVar89._12_4_ * fVar222,
                                  CONCAT48(auVar89._8_4_ * fVar221,
                                           CONCAT44(auVar89._4_4_ * fVar220,auVar89._0_4_ * fVar169)
                                          )));
          auVar217 = ZEXT3264(local_5e0);
          auVar151._4_4_ = local_560;
          auVar151._0_4_ = local_560;
          auVar151._8_4_ = local_560;
          auVar151._12_4_ = local_560;
          auVar151._16_4_ = local_560;
          auVar151._20_4_ = local_560;
          auVar151._24_4_ = local_560;
          auVar151._28_4_ = local_560;
          uVar162 = vcmpps_avx512vl(local_5e0,auVar232,2);
          uVar28 = vcmpps_avx512vl(auVar151,local_5e0,2);
          bVar78 = (byte)uVar162 & (byte)uVar28 & bVar78;
          if (bVar78 != 0) {
            uVar79 = vcmpps_avx512vl(ZEXT1632(auVar83),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar79 = bVar78 & uVar79;
            if ((char)uVar79 != '\0') {
              fVar168 = auVar96._0_4_ * fVar169;
              fVar181 = auVar96._4_4_ * fVar220;
              auVar41._4_4_ = fVar181;
              auVar41._0_4_ = fVar168;
              fVar80 = auVar96._8_4_ * fVar221;
              auVar41._8_4_ = fVar80;
              fVar81 = auVar96._12_4_ * fVar222;
              auVar41._12_4_ = fVar81;
              fVar133 = auVar96._16_4_ * 0.0;
              auVar41._16_4_ = fVar133;
              fVar134 = auVar96._20_4_ * 0.0;
              auVar41._20_4_ = fVar134;
              fVar135 = auVar96._24_4_ * 0.0;
              auVar41._24_4_ = fVar135;
              auVar41._28_4_ = auVar96._28_4_;
              auVar152._8_4_ = 0x3f800000;
              auVar152._0_8_ = 0x3f8000003f800000;
              auVar152._12_4_ = 0x3f800000;
              auVar152._16_4_ = 0x3f800000;
              auVar152._20_4_ = 0x3f800000;
              auVar152._24_4_ = 0x3f800000;
              auVar152._28_4_ = 0x3f800000;
              auVar107 = vsubps_avx(auVar152,auVar41);
              local_400._0_4_ =
                   (float)((uint)(bVar69 & 1) * (int)fVar168 |
                          (uint)!(bool)(bVar69 & 1) * auVar107._0_4_);
              bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
              local_400._4_4_ =
                   (float)((uint)bVar13 * (int)fVar181 | (uint)!bVar13 * auVar107._4_4_);
              bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
              local_400._8_4_ = (float)((uint)bVar13 * (int)fVar80 | (uint)!bVar13 * auVar107._8_4_)
              ;
              bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
              local_400._12_4_ =
                   (float)((uint)bVar13 * (int)fVar81 | (uint)!bVar13 * auVar107._12_4_);
              bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
              local_400._16_4_ =
                   (float)((uint)bVar13 * (int)fVar133 | (uint)!bVar13 * auVar107._16_4_);
              bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
              local_400._20_4_ =
                   (float)((uint)bVar13 * (int)fVar134 | (uint)!bVar13 * auVar107._20_4_);
              bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
              local_400._24_4_ =
                   (float)((uint)bVar13 * (int)fVar135 | (uint)!bVar13 * auVar107._24_4_);
              bVar13 = SUB81(uVar70 >> 7,0);
              local_400._28_4_ =
                   (float)((uint)bVar13 * auVar96._28_4_ | (uint)!bVar13 * auVar107._28_4_);
              auVar107 = vsubps_avx(ZEXT1632(auVar27),auVar101);
              auVar82 = vfmadd213ps_fma(auVar107,local_400,auVar101);
              uVar143 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar101._4_4_ = uVar143;
              auVar101._0_4_ = uVar143;
              auVar101._8_4_ = uVar143;
              auVar101._12_4_ = uVar143;
              auVar101._16_4_ = uVar143;
              auVar101._20_4_ = uVar143;
              auVar101._24_4_ = uVar143;
              auVar101._28_4_ = uVar143;
              auVar107 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                            CONCAT48(auVar82._8_4_ + auVar82._8_4_,
                                                                     CONCAT44(auVar82._4_4_ +
                                                                              auVar82._4_4_,
                                                                              auVar82._0_4_ +
                                                                              auVar82._0_4_)))),
                                         auVar101);
              uVar29 = vcmpps_avx512vl(local_5e0,auVar107,6);
              uVar79 = uVar79 & uVar29;
              bVar78 = (byte)uVar79;
              if (bVar78 != 0) {
                auVar179._0_4_ = auVar97._0_4_ * fVar169;
                auVar179._4_4_ = auVar97._4_4_ * fVar220;
                auVar179._8_4_ = auVar97._8_4_ * fVar221;
                auVar179._12_4_ = auVar97._12_4_ * fVar222;
                auVar179._16_4_ = auVar97._16_4_ * 0.0;
                auVar179._20_4_ = auVar97._20_4_ * 0.0;
                auVar179._24_4_ = auVar97._24_4_ * 0.0;
                auVar179._28_4_ = 0;
                auVar189._8_4_ = 0x3f800000;
                auVar189._0_8_ = 0x3f8000003f800000;
                auVar189._12_4_ = 0x3f800000;
                auVar189._16_4_ = 0x3f800000;
                auVar189._20_4_ = 0x3f800000;
                auVar189._24_4_ = 0x3f800000;
                auVar189._28_4_ = 0x3f800000;
                auVar107 = vsubps_avx(auVar189,auVar179);
                auVar118._0_4_ =
                     (uint)(bVar69 & 1) * (int)auVar179._0_4_ |
                     (uint)!(bool)(bVar69 & 1) * auVar107._0_4_;
                bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
                auVar118._4_4_ = (uint)bVar13 * (int)auVar179._4_4_ | (uint)!bVar13 * auVar107._4_4_
                ;
                bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
                auVar118._8_4_ = (uint)bVar13 * (int)auVar179._8_4_ | (uint)!bVar13 * auVar107._8_4_
                ;
                bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
                auVar118._12_4_ =
                     (uint)bVar13 * (int)auVar179._12_4_ | (uint)!bVar13 * auVar107._12_4_;
                bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
                auVar118._16_4_ =
                     (uint)bVar13 * (int)auVar179._16_4_ | (uint)!bVar13 * auVar107._16_4_;
                bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
                auVar118._20_4_ =
                     (uint)bVar13 * (int)auVar179._20_4_ | (uint)!bVar13 * auVar107._20_4_;
                bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
                auVar118._24_4_ =
                     (uint)bVar13 * (int)auVar179._24_4_ | (uint)!bVar13 * auVar107._24_4_;
                auVar118._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar107._28_4_;
                auVar33._8_4_ = 0x40000000;
                auVar33._0_8_ = 0x4000000040000000;
                auVar33._12_4_ = 0x40000000;
                auVar33._16_4_ = 0x40000000;
                auVar33._20_4_ = 0x40000000;
                auVar33._24_4_ = 0x40000000;
                auVar33._28_4_ = 0x40000000;
                local_3e0 = vfmsub132ps_avx512vl(auVar118,auVar189,auVar33);
                local_3a0 = 0;
                local_390 = local_670;
                uStack_388 = uStack_668;
                local_380 = local_680;
                uStack_378 = uStack_678;
                local_370 = local_690;
                uStack_368 = uStack_688;
                local_360 = local_6a0;
                uStack_358 = uStack_698;
                if ((pGVar75->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  fVar169 = 1.0 / auVar103._0_4_;
                  local_340[0] = fVar169 * (local_400._0_4_ + 0.0);
                  local_340[1] = fVar169 * (local_400._4_4_ + 1.0);
                  local_340[2] = fVar169 * (local_400._8_4_ + 2.0);
                  local_340[3] = fVar169 * (local_400._12_4_ + 3.0);
                  fStack_330 = fVar169 * (local_400._16_4_ + 4.0);
                  fStack_32c = fVar169 * (local_400._20_4_ + 5.0);
                  fStack_328 = fVar169 * (local_400._24_4_ + 6.0);
                  fStack_324 = local_400._28_4_ + 7.0;
                  local_320 = local_3e0;
                  local_300 = local_5e0;
                  auVar153._8_4_ = 0x7f800000;
                  auVar153._0_8_ = 0x7f8000007f800000;
                  auVar153._12_4_ = 0x7f800000;
                  auVar153._16_4_ = 0x7f800000;
                  auVar153._20_4_ = 0x7f800000;
                  auVar153._24_4_ = 0x7f800000;
                  auVar153._28_4_ = 0x7f800000;
                  auVar107 = vblendmps_avx512vl(auVar153,local_5e0);
                  auVar119._0_4_ =
                       (uint)(bVar78 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar79 >> 1) & 1);
                  auVar119._4_4_ = (uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar79 >> 2) & 1);
                  auVar119._8_4_ = (uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar79 >> 3) & 1);
                  auVar119._12_4_ = (uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar79 >> 4) & 1);
                  auVar119._16_4_ = (uint)bVar13 * auVar107._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar79 >> 5) & 1);
                  auVar119._20_4_ = (uint)bVar13 * auVar107._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar79 >> 6) & 1);
                  auVar119._24_4_ = (uint)bVar13 * auVar107._24_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = SUB81(uVar79 >> 7,0);
                  auVar119._28_4_ = (uint)bVar13 * auVar107._28_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar107 = vshufps_avx(auVar119,auVar119,0xb1);
                  auVar107 = vminps_avx(auVar119,auVar107);
                  auVar108 = vshufpd_avx(auVar107,auVar107,5);
                  auVar107 = vminps_avx(auVar107,auVar108);
                  auVar108 = vpermpd_avx2(auVar107,0x4e);
                  auVar107 = vminps_avx(auVar107,auVar108);
                  uVar162 = vcmpps_avx512vl(auVar119,auVar107,0);
                  uVar71 = (uint)uVar79;
                  if (((byte)uVar162 & bVar78) != 0) {
                    uVar71 = (uint)((byte)uVar162 & bVar78);
                  }
                  uVar72 = 0;
                  for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                    uVar72 = uVar72 + 1;
                  }
                  uVar70 = (ulong)uVar72;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_520 = vpbroadcastd_avx512vl();
                    local_540 = vpbroadcastd_avx512vl();
                    local_3c0 = local_5e0;
                    local_39c = iVar8;
                    do {
                      local_1c0 = local_340[uVar70];
                      local_1a0 = *(undefined4 *)(local_320 + uVar70 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar70 * 4)
                      ;
                      local_660.context = context->user;
                      fVar220 = 1.0 - local_1c0;
                      fVar169 = fVar220 * fVar220 * -3.0;
                      auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar220 * fVar220)),
                                                ZEXT416((uint)(local_1c0 * fVar220)),
                                                ZEXT416(0xc0000000));
                      auVar83 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar220)),
                                                ZEXT416((uint)(local_1c0 * local_1c0)),
                                                ZEXT416(0x40000000));
                      fVar220 = auVar82._0_4_ * 3.0;
                      fVar221 = auVar83._0_4_ * 3.0;
                      fVar222 = local_1c0 * local_1c0 * 3.0;
                      auVar208._0_4_ = fVar222 * fVar142;
                      auVar208._4_4_ = fVar222 * fVar159;
                      auVar208._8_4_ = fVar222 * fVar160;
                      auVar208._12_4_ = fVar222 * fVar161;
                      auVar149._4_4_ = fVar221;
                      auVar149._0_4_ = fVar221;
                      auVar149._8_4_ = fVar221;
                      auVar149._12_4_ = fVar221;
                      auVar82 = vfmadd132ps_fma(auVar149,auVar208,auVar87);
                      auVar188._4_4_ = fVar220;
                      auVar188._0_4_ = fVar220;
                      auVar188._8_4_ = fVar220;
                      auVar188._12_4_ = fVar220;
                      auVar82 = vfmadd132ps_fma(auVar188,auVar82,auVar21);
                      auVar150._4_4_ = fVar169;
                      auVar150._0_4_ = fVar169;
                      auVar150._8_4_ = fVar169;
                      auVar150._12_4_ = fVar169;
                      auVar82 = vfmadd132ps_fma(auVar150,auVar82,auVar20);
                      local_220 = auVar82._0_4_;
                      auVar199._8_4_ = 1;
                      auVar199._0_8_ = 0x100000001;
                      auVar199._12_4_ = 1;
                      auVar199._16_4_ = 1;
                      auVar199._20_4_ = 1;
                      auVar199._24_4_ = 1;
                      auVar199._28_4_ = 1;
                      local_200 = vpermps_avx2(auVar199,ZEXT1632(auVar82));
                      auVar200 = ZEXT3264(local_200);
                      auVar209._8_4_ = 2;
                      auVar209._0_8_ = 0x200000002;
                      auVar209._12_4_ = 2;
                      auVar211._16_4_ = 2;
                      auVar211._0_16_ = auVar209;
                      auVar211._20_4_ = 2;
                      auVar211._24_4_ = 2;
                      auVar211._28_4_ = 2;
                      auVar212 = ZEXT3264(auVar211);
                      local_1e0 = vpermps_avx2(auVar211,ZEXT1632(auVar82));
                      iStack_21c = local_220;
                      iStack_218 = local_220;
                      iStack_214 = local_220;
                      iStack_210 = local_220;
                      iStack_20c = local_220;
                      iStack_208 = local_220;
                      iStack_204 = local_220;
                      fStack_1bc = local_1c0;
                      fStack_1b8 = local_1c0;
                      fStack_1b4 = local_1c0;
                      fStack_1b0 = local_1c0;
                      fStack_1ac = local_1c0;
                      fStack_1a8 = local_1c0;
                      fStack_1a4 = local_1c0;
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = local_540._0_8_;
                      uStack_178 = local_540._8_8_;
                      uStack_170 = local_540._16_8_;
                      uStack_168 = local_540._24_8_;
                      local_160 = local_520;
                      auVar107 = vpcmpeqd_avx2(local_520,local_520);
                      local_628[1] = auVar107;
                      *local_628 = auVar107;
                      local_140 = (local_660.context)->instID[0];
                      uStack_13c = local_140;
                      uStack_138 = local_140;
                      uStack_134 = local_140;
                      uStack_130 = local_140;
                      uStack_12c = local_140;
                      uStack_128 = local_140;
                      uStack_124 = local_140;
                      local_120 = (local_660.context)->instPrimID[0];
                      uStack_11c = local_120;
                      uStack_118 = local_120;
                      uStack_114 = local_120;
                      uStack_110 = local_120;
                      uStack_10c = local_120;
                      uStack_108 = local_120;
                      uStack_104 = local_120;
                      local_620 = local_2c0;
                      local_660.valid = (int *)local_620;
                      local_660.geometryUserPtr = pGVar75->userPtr;
                      local_660.hit = (RTCHitN *)&local_220;
                      local_660.N = 8;
                      local_5a0 = auVar235._0_32_;
                      local_660.ray = (RTCRayN *)ray;
                      if (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar200 = ZEXT1664(local_200._0_16_);
                        auVar212 = ZEXT1664(auVar209);
                        (*pGVar75->intersectionFilterN)(&local_660);
                        auVar217 = ZEXT3264(local_5e0);
                        auVar235 = ZEXT3264(local_5a0);
                        auVar238 = ZEXT464(0xbf800000);
                        auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar237 = ZEXT1664(auVar82);
                      }
                      if (local_620 == (undefined1  [32])0x0) {
LAB_01b80db3:
                        *(int *)(ray + k * 4 + 0x100) = auVar235._0_4_;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar75->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar200 = ZEXT1664(auVar200._0_16_);
                          auVar212 = ZEXT1664(auVar212._0_16_);
                          (*p_Var12)(&local_660);
                          auVar217 = ZEXT3264(local_5e0);
                          auVar235 = ZEXT3264(local_5a0);
                          auVar238 = ZEXT464(0xbf800000);
                          auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar237 = ZEXT1664(auVar82);
                        }
                        if (local_620 == (undefined1  [32])0x0) goto LAB_01b80db3;
                        uVar29 = vptestmd_avx512vl(local_620,local_620);
                        iVar1 = *(int *)(local_660.hit + 4);
                        iVar2 = *(int *)(local_660.hit + 8);
                        iVar62 = *(int *)(local_660.hit + 0xc);
                        iVar63 = *(int *)(local_660.hit + 0x10);
                        iVar64 = *(int *)(local_660.hit + 0x14);
                        iVar65 = *(int *)(local_660.hit + 0x18);
                        iVar66 = *(int *)(local_660.hit + 0x1c);
                        bVar78 = (byte)uVar29;
                        bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                        bVar19 = SUB81(uVar29 >> 7,0);
                        *(uint *)(local_660.ray + 0x180) =
                             (uint)(bVar78 & 1) * *(int *)local_660.hit |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_660.ray + 0x180);
                        *(uint *)(local_660.ray + 0x184) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_660.ray + 0x184);
                        *(uint *)(local_660.ray + 0x188) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_660.ray + 0x188);
                        *(uint *)(local_660.ray + 0x18c) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_660.ray + 0x18c)
                        ;
                        *(uint *)(local_660.ray + 400) =
                             (uint)bVar16 * iVar63 | (uint)!bVar16 * *(int *)(local_660.ray + 400);
                        *(uint *)(local_660.ray + 0x194) =
                             (uint)bVar17 * iVar64 | (uint)!bVar17 * *(int *)(local_660.ray + 0x194)
                        ;
                        *(uint *)(local_660.ray + 0x198) =
                             (uint)bVar18 * iVar65 | (uint)!bVar18 * *(int *)(local_660.ray + 0x198)
                        ;
                        *(uint *)(local_660.ray + 0x19c) =
                             (uint)bVar19 * iVar66 | (uint)!bVar19 * *(int *)(local_660.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_660.hit + 0x24);
                        iVar2 = *(int *)(local_660.hit + 0x28);
                        iVar62 = *(int *)(local_660.hit + 0x2c);
                        iVar63 = *(int *)(local_660.hit + 0x30);
                        iVar64 = *(int *)(local_660.hit + 0x34);
                        iVar65 = *(int *)(local_660.hit + 0x38);
                        iVar66 = *(int *)(local_660.hit + 0x3c);
                        bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                        bVar19 = SUB81(uVar29 >> 7,0);
                        *(uint *)(local_660.ray + 0x1a0) =
                             (uint)(bVar78 & 1) * *(int *)(local_660.hit + 0x20) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_660.ray + 0x1a0);
                        *(uint *)(local_660.ray + 0x1a4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_660.ray + 0x1a4);
                        *(uint *)(local_660.ray + 0x1a8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_660.ray + 0x1a8);
                        *(uint *)(local_660.ray + 0x1ac) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_660.ray + 0x1ac)
                        ;
                        *(uint *)(local_660.ray + 0x1b0) =
                             (uint)bVar16 * iVar63 | (uint)!bVar16 * *(int *)(local_660.ray + 0x1b0)
                        ;
                        *(uint *)(local_660.ray + 0x1b4) =
                             (uint)bVar17 * iVar64 | (uint)!bVar17 * *(int *)(local_660.ray + 0x1b4)
                        ;
                        *(uint *)(local_660.ray + 0x1b8) =
                             (uint)bVar18 * iVar65 | (uint)!bVar18 * *(int *)(local_660.ray + 0x1b8)
                        ;
                        *(uint *)(local_660.ray + 0x1bc) =
                             (uint)bVar19 * iVar66 | (uint)!bVar19 * *(int *)(local_660.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_660.hit + 0x44);
                        iVar2 = *(int *)(local_660.hit + 0x48);
                        iVar62 = *(int *)(local_660.hit + 0x4c);
                        iVar63 = *(int *)(local_660.hit + 0x50);
                        iVar64 = *(int *)(local_660.hit + 0x54);
                        iVar65 = *(int *)(local_660.hit + 0x58);
                        iVar66 = *(int *)(local_660.hit + 0x5c);
                        bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                        bVar19 = SUB81(uVar29 >> 7,0);
                        *(uint *)(local_660.ray + 0x1c0) =
                             (uint)(bVar78 & 1) * *(int *)(local_660.hit + 0x40) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_660.ray + 0x1c0);
                        *(uint *)(local_660.ray + 0x1c4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_660.ray + 0x1c4);
                        *(uint *)(local_660.ray + 0x1c8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_660.ray + 0x1c8);
                        *(uint *)(local_660.ray + 0x1cc) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_660.ray + 0x1cc)
                        ;
                        *(uint *)(local_660.ray + 0x1d0) =
                             (uint)bVar16 * iVar63 | (uint)!bVar16 * *(int *)(local_660.ray + 0x1d0)
                        ;
                        *(uint *)(local_660.ray + 0x1d4) =
                             (uint)bVar17 * iVar64 | (uint)!bVar17 * *(int *)(local_660.ray + 0x1d4)
                        ;
                        *(uint *)(local_660.ray + 0x1d8) =
                             (uint)bVar18 * iVar65 | (uint)!bVar18 * *(int *)(local_660.ray + 0x1d8)
                        ;
                        *(uint *)(local_660.ray + 0x1dc) =
                             (uint)bVar19 * iVar66 | (uint)!bVar19 * *(int *)(local_660.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_660.hit + 100);
                        iVar2 = *(int *)(local_660.hit + 0x68);
                        iVar62 = *(int *)(local_660.hit + 0x6c);
                        iVar63 = *(int *)(local_660.hit + 0x70);
                        iVar64 = *(int *)(local_660.hit + 0x74);
                        iVar65 = *(int *)(local_660.hit + 0x78);
                        iVar66 = *(int *)(local_660.hit + 0x7c);
                        bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                        bVar19 = SUB81(uVar29 >> 7,0);
                        *(uint *)(local_660.ray + 0x1e0) =
                             (uint)(bVar78 & 1) * *(int *)(local_660.hit + 0x60) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_660.ray + 0x1e0);
                        *(uint *)(local_660.ray + 0x1e4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_660.ray + 0x1e4);
                        *(uint *)(local_660.ray + 0x1e8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_660.ray + 0x1e8);
                        *(uint *)(local_660.ray + 0x1ec) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_660.ray + 0x1ec)
                        ;
                        *(uint *)(local_660.ray + 0x1f0) =
                             (uint)bVar16 * iVar63 | (uint)!bVar16 * *(int *)(local_660.ray + 0x1f0)
                        ;
                        *(uint *)(local_660.ray + 500) =
                             (uint)bVar17 * iVar64 | (uint)!bVar17 * *(int *)(local_660.ray + 500);
                        *(uint *)(local_660.ray + 0x1f8) =
                             (uint)bVar18 * iVar65 | (uint)!bVar18 * *(int *)(local_660.ray + 0x1f8)
                        ;
                        *(uint *)(local_660.ray + 0x1fc) =
                             (uint)bVar19 * iVar66 | (uint)!bVar19 * *(int *)(local_660.ray + 0x1fc)
                        ;
                        iVar1 = *(int *)(local_660.hit + 0x84);
                        iVar2 = *(int *)(local_660.hit + 0x88);
                        iVar62 = *(int *)(local_660.hit + 0x8c);
                        iVar63 = *(int *)(local_660.hit + 0x90);
                        iVar64 = *(int *)(local_660.hit + 0x94);
                        iVar65 = *(int *)(local_660.hit + 0x98);
                        iVar66 = *(int *)(local_660.hit + 0x9c);
                        bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                        bVar19 = SUB81(uVar29 >> 7,0);
                        *(uint *)(local_660.ray + 0x200) =
                             (uint)(bVar78 & 1) * *(int *)(local_660.hit + 0x80) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_660.ray + 0x200);
                        *(uint *)(local_660.ray + 0x204) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_660.ray + 0x204);
                        *(uint *)(local_660.ray + 0x208) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_660.ray + 0x208);
                        *(uint *)(local_660.ray + 0x20c) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_660.ray + 0x20c)
                        ;
                        *(uint *)(local_660.ray + 0x210) =
                             (uint)bVar16 * iVar63 | (uint)!bVar16 * *(int *)(local_660.ray + 0x210)
                        ;
                        *(uint *)(local_660.ray + 0x214) =
                             (uint)bVar17 * iVar64 | (uint)!bVar17 * *(int *)(local_660.ray + 0x214)
                        ;
                        *(uint *)(local_660.ray + 0x218) =
                             (uint)bVar18 * iVar65 | (uint)!bVar18 * *(int *)(local_660.ray + 0x218)
                        ;
                        *(uint *)(local_660.ray + 0x21c) =
                             (uint)bVar19 * iVar66 | (uint)!bVar19 * *(int *)(local_660.ray + 0x21c)
                        ;
                        auVar107 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xa0));
                        *(undefined1 (*) [32])(local_660.ray + 0x220) = auVar107;
                        auVar107 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xc0));
                        *(undefined1 (*) [32])(local_660.ray + 0x240) = auVar107;
                        auVar107 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xe0));
                        *(undefined1 (*) [32])(local_660.ray + 0x260) = auVar107;
                        auVar107 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_660.ray + 0x280) = auVar107;
                        auVar235 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                      }
                      bVar78 = ~(byte)(1 << ((uint)uVar70 & 0x1f)) & (byte)uVar79;
                      uVar143 = auVar235._0_4_;
                      auVar157._4_4_ = uVar143;
                      auVar157._0_4_ = uVar143;
                      auVar157._8_4_ = uVar143;
                      auVar157._12_4_ = uVar143;
                      auVar157._16_4_ = uVar143;
                      auVar157._20_4_ = uVar143;
                      auVar157._24_4_ = uVar143;
                      auVar157._28_4_ = uVar143;
                      uVar162 = vcmpps_avx512vl(auVar217._0_32_,auVar157,2);
                      if ((bVar78 & (byte)uVar162) == 0) goto LAB_01b7fd0c;
                      bVar78 = bVar78 & (byte)uVar162;
                      uVar79 = (ulong)bVar78;
                      auVar158._8_4_ = 0x7f800000;
                      auVar158._0_8_ = 0x7f8000007f800000;
                      auVar158._12_4_ = 0x7f800000;
                      auVar158._16_4_ = 0x7f800000;
                      auVar158._20_4_ = 0x7f800000;
                      auVar158._24_4_ = 0x7f800000;
                      auVar158._28_4_ = 0x7f800000;
                      auVar107 = vblendmps_avx512vl(auVar158,auVar217._0_32_);
                      auVar132._0_4_ =
                           (uint)(bVar78 & 1) * auVar107._0_4_ |
                           (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                      bVar13 = (bool)(bVar78 >> 1 & 1);
                      auVar132._4_4_ = (uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar78 >> 2 & 1);
                      auVar132._8_4_ = (uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar78 >> 3 & 1);
                      auVar132._12_4_ = (uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar78 >> 4 & 1);
                      auVar132._16_4_ = (uint)bVar13 * auVar107._16_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar78 >> 5 & 1);
                      auVar132._20_4_ = (uint)bVar13 * auVar107._20_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar78 >> 6 & 1);
                      auVar132._24_4_ = (uint)bVar13 * auVar107._24_4_ | (uint)!bVar13 * 0x7f800000;
                      auVar132._28_4_ =
                           (uint)(bVar78 >> 7) * auVar107._28_4_ |
                           (uint)!(bool)(bVar78 >> 7) * 0x7f800000;
                      auVar107 = vshufps_avx(auVar132,auVar132,0xb1);
                      auVar107 = vminps_avx(auVar132,auVar107);
                      auVar108 = vshufpd_avx(auVar107,auVar107,5);
                      auVar107 = vminps_avx(auVar107,auVar108);
                      auVar108 = vpermpd_avx2(auVar107,0x4e);
                      auVar107 = vminps_avx(auVar107,auVar108);
                      uVar162 = vcmpps_avx512vl(auVar132,auVar107,0);
                      bVar69 = (byte)uVar162 & bVar78;
                      if (bVar69 != 0) {
                        bVar78 = bVar69;
                      }
                      uVar71 = 0;
                      for (uVar72 = (uint)bVar78; (uVar72 & 1) == 0;
                          uVar72 = uVar72 >> 1 | 0x80000000) {
                        uVar71 = uVar71 + 1;
                      }
                      uVar70 = (ulong)uVar71;
                    } while( true );
                  }
                  fVar169 = local_340[uVar70];
                  uVar143 = *(undefined4 *)(local_320 + uVar70 * 4);
                  fVar221 = 1.0 - fVar169;
                  fVar220 = fVar221 * fVar221 * -3.0;
                  auVar200 = ZEXT464((uint)fVar220);
                  auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar221 * fVar221)),
                                            ZEXT416((uint)(fVar169 * fVar221)),ZEXT416(0xc0000000));
                  auVar83 = vfmsub132ss_fma(ZEXT416((uint)(fVar169 * fVar221)),
                                            ZEXT416((uint)(fVar169 * fVar169)),ZEXT416(0x40000000));
                  fVar221 = auVar82._0_4_ * 3.0;
                  fVar222 = auVar83._0_4_ * 3.0;
                  fVar168 = fVar169 * fVar169 * 3.0;
                  auVar204._0_4_ = fVar168 * fVar142;
                  auVar204._4_4_ = fVar168 * fVar159;
                  auVar204._8_4_ = fVar168 * fVar160;
                  auVar204._12_4_ = fVar168 * fVar161;
                  auVar212 = ZEXT1664(auVar204);
                  auVar175._4_4_ = fVar222;
                  auVar175._0_4_ = fVar222;
                  auVar175._8_4_ = fVar222;
                  auVar175._12_4_ = fVar222;
                  auVar82 = vfmadd132ps_fma(auVar175,auVar204,auVar87);
                  auVar185._4_4_ = fVar221;
                  auVar185._0_4_ = fVar221;
                  auVar185._8_4_ = fVar221;
                  auVar185._12_4_ = fVar221;
                  auVar82 = vfmadd132ps_fma(auVar185,auVar82,auVar21);
                  auVar176._4_4_ = fVar220;
                  auVar176._0_4_ = fVar220;
                  auVar176._8_4_ = fVar220;
                  auVar176._12_4_ = fVar220;
                  auVar82 = vfmadd132ps_fma(auVar176,auVar82,auVar20);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar70 * 4);
                  *(int *)(ray + k * 4 + 0x180) = auVar82._0_4_;
                  uVar9 = vextractps_avx(auVar82,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                  uVar9 = vextractps_avx(auVar82,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar9;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar169;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar143;
                  *(uint *)(ray + k * 4 + 0x220) = uVar7;
                  *(uint *)(ray + k * 4 + 0x240) = uVar76;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01b7fd0c:
      if (8 < iVar8) {
        local_5a0 = vpbroadcastd_avx512vl();
        local_520._4_4_ = local_5c0._0_4_;
        local_520._0_4_ = local_5c0._0_4_;
        local_520._8_4_ = local_5c0._0_4_;
        local_520._12_4_ = local_5c0._0_4_;
        local_520._16_4_ = local_5c0._0_4_;
        local_520._20_4_ = local_5c0._0_4_;
        local_520._24_4_ = local_5c0._0_4_;
        local_520._28_4_ = local_5c0._0_4_;
        uStack_55c = local_560;
        uStack_558 = local_560;
        uStack_554 = local_560;
        uStack_550 = local_560;
        uStack_54c = local_560;
        uStack_548 = local_560;
        uStack_544 = local_560;
        local_100 = 1.0 / (float)local_580._0_4_;
        fStack_fc = local_100;
        fStack_f8 = local_100;
        fStack_f4 = local_100;
        fStack_f0 = local_100;
        fStack_ec = local_100;
        fStack_e8 = local_100;
        fStack_e4 = local_100;
        local_580 = vpbroadcastd_avx512vl();
        local_540 = vpbroadcastd_avx512vl();
        lVar73 = 8;
LAB_01b7fdc8:
        auVar107 = vpbroadcastd_avx512vl();
        auVar107 = vpor_avx2(auVar107,_DAT_01fe9900);
        uVar28 = vpcmpd_avx512vl(auVar107,local_5a0,1);
        auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 * 4 + lVar30);
        auVar108 = *(undefined1 (*) [32])(lVar30 + 0x21aa768 + lVar73 * 4);
        auVar106 = *(undefined1 (*) [32])(lVar30 + 0x21aabec + lVar73 * 4);
        auVar105 = *(undefined1 (*) [32])(lVar30 + 0x21ab070 + lVar73 * 4);
        fVar169 = auVar105._0_4_;
        auVar235._0_4_ = fVar169 * (float)local_4e0._0_4_;
        fVar220 = auVar105._4_4_;
        auVar235._4_4_ = fVar220 * (float)local_4e0._4_4_;
        fVar221 = auVar105._8_4_;
        auVar235._8_4_ = fVar221 * fStack_4d8;
        fVar222 = auVar105._12_4_;
        auVar235._12_4_ = fVar222 * fStack_4d4;
        fVar168 = auVar105._16_4_;
        auVar235._16_4_ = fVar168 * fStack_4d0;
        fVar181 = auVar105._20_4_;
        auVar235._20_4_ = fVar181 * fStack_4cc;
        auVar235._28_36_ = auVar212._28_36_;
        fVar80 = auVar105._24_4_;
        auVar235._24_4_ = fVar80 * fStack_4c8;
        auVar212._0_4_ = fVar169 * (float)local_500._0_4_;
        auVar212._4_4_ = fVar220 * (float)local_500._4_4_;
        auVar212._8_4_ = fVar221 * fStack_4f8;
        auVar212._12_4_ = fVar222 * fStack_4f4;
        auVar212._16_4_ = fVar168 * fStack_4f0;
        auVar212._20_4_ = fVar181 * fStack_4ec;
        auVar212._28_36_ = auVar200._28_36_;
        auVar212._24_4_ = fVar80 * fStack_4e8;
        auVar93 = vmulps_avx512vl(local_e0,auVar105);
        auVar94 = vfmadd231ps_avx512vl(auVar235._0_32_,auVar106,local_4a0);
        auVar104 = vfmadd231ps_avx512vl(auVar212._0_32_,auVar106,local_4c0);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar106,local_c0);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar108,local_460);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar108,local_480);
        auVar95 = vfmadd231ps_avx512vl(auVar93,auVar108,local_a0);
        auVar82 = vfmadd231ps_fma(auVar94,auVar107,local_420);
        auVar212 = ZEXT1664(auVar82);
        auVar83 = vfmadd231ps_fma(auVar104,auVar107,local_440);
        auVar200 = ZEXT1664(auVar83);
        auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 * 4 + lVar30);
        auVar94 = *(undefined1 (*) [32])(lVar30 + 0x21acb88 + lVar73 * 4);
        auVar96 = vfmadd231ps_avx512vl(auVar95,auVar107,local_80);
        auVar104 = *(undefined1 (*) [32])(lVar30 + 0x21ad00c + lVar73 * 4);
        auVar95 = *(undefined1 (*) [32])(lVar30 + 0x21ad490 + lVar73 * 4);
        fVar81 = auVar95._0_4_;
        auVar218._0_4_ = fVar81 * (float)local_4e0._0_4_;
        fVar133 = auVar95._4_4_;
        auVar218._4_4_ = fVar133 * (float)local_4e0._4_4_;
        fVar134 = auVar95._8_4_;
        auVar218._8_4_ = fVar134 * fStack_4d8;
        fVar135 = auVar95._12_4_;
        auVar218._12_4_ = fVar135 * fStack_4d4;
        fVar136 = auVar95._16_4_;
        auVar218._16_4_ = fVar136 * fStack_4d0;
        fVar138 = auVar95._20_4_;
        auVar218._20_4_ = fVar138 * fStack_4cc;
        auVar218._28_36_ = auVar217._28_36_;
        fVar139 = auVar95._24_4_;
        auVar218._24_4_ = fVar139 * fStack_4c8;
        auVar42._4_4_ = fVar133 * (float)local_500._4_4_;
        auVar42._0_4_ = fVar81 * (float)local_500._0_4_;
        auVar42._8_4_ = fVar134 * fStack_4f8;
        auVar42._12_4_ = fVar135 * fStack_4f4;
        auVar42._16_4_ = fVar136 * fStack_4f0;
        auVar42._20_4_ = fVar138 * fStack_4ec;
        auVar42._24_4_ = fVar139 * fStack_4e8;
        auVar42._28_4_ = uStack_4e4;
        auVar98 = vmulps_avx512vl(local_e0,auVar95);
        auVar97 = vfmadd231ps_avx512vl(auVar218._0_32_,auVar104,local_4a0);
        auVar99 = vfmadd231ps_avx512vl(auVar42,auVar104,local_4c0);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar104,local_c0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,local_460);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,local_480);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_a0);
        auVar89 = vfmadd231ps_fma(auVar97,auVar93,local_420);
        auVar217 = ZEXT1664(auVar89);
        auVar22 = vfmadd231ps_fma(auVar99,auVar93,local_440);
        auVar97 = vfmadd231ps_avx512vl(auVar98,auVar93,local_80);
        auVar99 = vmaxps_avx512vl(auVar96,auVar97);
        auVar98 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar82));
        auVar100 = vsubps_avx512vl(ZEXT1632(auVar22),ZEXT1632(auVar83));
        auVar101 = vmulps_avx512vl(ZEXT1632(auVar83),auVar98);
        auVar102 = vmulps_avx512vl(ZEXT1632(auVar82),auVar100);
        auVar101 = vsubps_avx512vl(auVar101,auVar102);
        auVar102 = vmulps_avx512vl(auVar100,auVar100);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,auVar98);
        auVar99 = vmulps_avx512vl(auVar99,auVar99);
        auVar99 = vmulps_avx512vl(auVar99,auVar102);
        auVar101 = vmulps_avx512vl(auVar101,auVar101);
        uVar162 = vcmpps_avx512vl(auVar101,auVar99,2);
        bVar78 = (byte)uVar28 & (byte)uVar162;
        if (bVar78 != 0) {
          fVar137 = local_2a0._0_4_;
          fVar140 = local_2a0._4_4_;
          auVar43._4_4_ = fVar140 * fVar133;
          auVar43._0_4_ = fVar137 * fVar81;
          fVar81 = local_2a0._8_4_;
          auVar43._8_4_ = fVar81 * fVar134;
          fVar133 = local_2a0._12_4_;
          auVar43._12_4_ = fVar133 * fVar135;
          fVar134 = local_2a0._16_4_;
          auVar43._16_4_ = fVar134 * fVar136;
          fVar135 = local_2a0._20_4_;
          auVar43._20_4_ = fVar135 * fVar138;
          fVar136 = local_2a0._24_4_;
          auVar43._24_4_ = fVar136 * fVar139;
          auVar43._28_4_ = auVar95._28_4_;
          auVar104 = vfmadd213ps_avx512vl(auVar104,local_280,auVar43);
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_260,auVar104);
          auVar93 = vfmadd213ps_avx512vl(auVar93,local_240,auVar94);
          auVar44._4_4_ = fVar140 * fVar220;
          auVar44._0_4_ = fVar137 * fVar169;
          auVar44._8_4_ = fVar81 * fVar221;
          auVar44._12_4_ = fVar133 * fVar222;
          auVar44._16_4_ = fVar134 * fVar168;
          auVar44._20_4_ = fVar135 * fVar181;
          auVar44._24_4_ = fVar136 * fVar80;
          auVar44._28_4_ = auVar105._28_4_;
          auVar106 = vfmadd213ps_avx512vl(auVar106,local_280,auVar44);
          auVar108 = vfmadd213ps_avx512vl(auVar108,local_260,auVar106);
          auVar94 = vfmadd213ps_avx512vl(auVar107,local_240,auVar108);
          auVar107 = *(undefined1 (*) [32])(lVar30 + 0x21ab4f4 + lVar73 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar30 + 0x21ab978 + lVar73 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar30 + 0x21abdfc + lVar73 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar30 + 0x21ac280 + lVar73 * 4);
          auVar104 = vmulps_avx512vl(_local_4e0,auVar105);
          auVar95 = vmulps_avx512vl(_local_500,auVar105);
          auVar45._4_4_ = fVar140 * auVar105._4_4_;
          auVar45._0_4_ = fVar137 * auVar105._0_4_;
          auVar45._8_4_ = fVar81 * auVar105._8_4_;
          auVar45._12_4_ = fVar133 * auVar105._12_4_;
          auVar45._16_4_ = fVar134 * auVar105._16_4_;
          auVar45._20_4_ = fVar135 * auVar105._20_4_;
          auVar45._24_4_ = fVar136 * auVar105._24_4_;
          auVar45._28_4_ = auVar105._28_4_;
          auVar105 = vfmadd231ps_avx512vl(auVar104,auVar106,local_4a0);
          auVar104 = vfmadd231ps_avx512vl(auVar95,auVar106,local_4c0);
          auVar106 = vfmadd231ps_avx512vl(auVar45,local_280,auVar106);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar108,local_460);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar108,local_480);
          auVar108 = vfmadd231ps_avx512vl(auVar106,local_260,auVar108);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,local_420);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,local_440);
          auVar95 = vfmadd231ps_avx512vl(auVar108,local_240,auVar107);
          auVar107 = *(undefined1 (*) [32])(lVar30 + 0x21ad914 + lVar73 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar30 + 0x21ae21c + lVar73 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar30 + 0x21ae6a0 + lVar73 * 4);
          auVar99 = vmulps_avx512vl(_local_4e0,auVar106);
          auVar101 = vmulps_avx512vl(_local_500,auVar106);
          auVar106 = vmulps_avx512vl(local_2a0,auVar106);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,local_4a0);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,local_4c0);
          auVar106 = vfmadd231ps_avx512vl(auVar106,local_280,auVar108);
          auVar237 = ZEXT1664(auVar237._0_16_);
          auVar108 = *(undefined1 (*) [32])(lVar30 + 0x21add98 + lVar73 * 4);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,local_460);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,local_480);
          auVar108 = vfmadd231ps_avx512vl(auVar106,local_260,auVar108);
          auVar238 = ZEXT1664(auVar238._0_16_);
          auVar106 = vfmadd231ps_avx512vl(auVar99,auVar107,local_420);
          auVar99 = vfmadd231ps_avx512vl(auVar101,auVar107,local_440);
          auVar108 = vfmadd231ps_avx512vl(auVar108,local_240,auVar107);
          auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar105,auVar101);
          vandps_avx512vl(auVar104,auVar101);
          auVar107 = vmaxps_avx(auVar101,auVar101);
          vandps_avx512vl(auVar95,auVar101);
          auVar107 = vmaxps_avx(auVar107,auVar101);
          uVar70 = vcmpps_avx512vl(auVar107,local_520,1);
          bVar13 = (bool)((byte)uVar70 & 1);
          auVar120._0_4_ = (float)((uint)bVar13 * auVar98._0_4_ | (uint)!bVar13 * auVar105._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar105._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar105._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar105._12_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar120._16_4_ = (float)((uint)bVar13 * auVar98._16_4_ | (uint)!bVar13 * auVar105._16_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar120._20_4_ = (float)((uint)bVar13 * auVar98._20_4_ | (uint)!bVar13 * auVar105._20_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar120._24_4_ = (float)((uint)bVar13 * auVar98._24_4_ | (uint)!bVar13 * auVar105._24_4_)
          ;
          bVar13 = SUB81(uVar70 >> 7,0);
          auVar120._28_4_ = (uint)bVar13 * auVar98._28_4_ | (uint)!bVar13 * auVar105._28_4_;
          bVar13 = (bool)((byte)uVar70 & 1);
          auVar121._0_4_ = (float)((uint)bVar13 * auVar100._0_4_ | (uint)!bVar13 * auVar104._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar104._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar104._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar121._12_4_ =
               (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar104._12_4_);
          bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar121._16_4_ =
               (float)((uint)bVar13 * auVar100._16_4_ | (uint)!bVar13 * auVar104._16_4_);
          bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar121._20_4_ =
               (float)((uint)bVar13 * auVar100._20_4_ | (uint)!bVar13 * auVar104._20_4_);
          bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar121._24_4_ =
               (float)((uint)bVar13 * auVar100._24_4_ | (uint)!bVar13 * auVar104._24_4_);
          bVar13 = SUB81(uVar70 >> 7,0);
          auVar121._28_4_ = (uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar104._28_4_;
          vandps_avx512vl(auVar106,auVar101);
          vandps_avx512vl(auVar99,auVar101);
          auVar107 = vmaxps_avx(auVar121,auVar121);
          vandps_avx512vl(auVar108,auVar101);
          auVar107 = vmaxps_avx(auVar107,auVar121);
          uVar70 = vcmpps_avx512vl(auVar107,local_520,1);
          bVar13 = (bool)((byte)uVar70 & 1);
          auVar122._0_4_ = (uint)bVar13 * auVar98._0_4_ | (uint)!bVar13 * auVar106._0_4_;
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar106._4_4_;
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar106._8_4_;
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar106._12_4_;
          bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar122._16_4_ = (uint)bVar13 * auVar98._16_4_ | (uint)!bVar13 * auVar106._16_4_;
          bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar122._20_4_ = (uint)bVar13 * auVar98._20_4_ | (uint)!bVar13 * auVar106._20_4_;
          bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar122._24_4_ = (uint)bVar13 * auVar98._24_4_ | (uint)!bVar13 * auVar106._24_4_;
          bVar13 = SUB81(uVar70 >> 7,0);
          auVar122._28_4_ = (uint)bVar13 * auVar98._28_4_ | (uint)!bVar13 * auVar106._28_4_;
          bVar13 = (bool)((byte)uVar70 & 1);
          auVar123._0_4_ = (float)((uint)bVar13 * auVar100._0_4_ | (uint)!bVar13 * auVar99._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar99._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar99._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar99._12_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar123._16_4_ = (float)((uint)bVar13 * auVar100._16_4_ | (uint)!bVar13 * auVar99._16_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar123._20_4_ = (float)((uint)bVar13 * auVar100._20_4_ | (uint)!bVar13 * auVar99._20_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar123._24_4_ = (float)((uint)bVar13 * auVar100._24_4_ | (uint)!bVar13 * auVar99._24_4_)
          ;
          bVar13 = SUB81(uVar70 >> 7,0);
          auVar123._28_4_ = (uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar99._28_4_;
          auVar225._8_4_ = 0x80000000;
          auVar225._0_8_ = 0x8000000080000000;
          auVar225._12_4_ = 0x80000000;
          auVar225._16_4_ = 0x80000000;
          auVar225._20_4_ = 0x80000000;
          auVar225._24_4_ = 0x80000000;
          auVar225._28_4_ = 0x80000000;
          auVar107 = vxorps_avx512vl(auVar122,auVar225);
          auVar92 = vxorps_avx512vl(auVar101._0_16_,auVar101._0_16_);
          auVar108 = vfmadd213ps_avx512vl(auVar120,auVar120,ZEXT1632(auVar92));
          auVar23 = vfmadd231ps_fma(auVar108,auVar121,auVar121);
          auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar23));
          auVar233._8_4_ = 0xbf000000;
          auVar233._0_8_ = 0xbf000000bf000000;
          auVar233._12_4_ = 0xbf000000;
          auVar233._16_4_ = 0xbf000000;
          auVar233._20_4_ = 0xbf000000;
          auVar233._24_4_ = 0xbf000000;
          auVar233._28_4_ = 0xbf000000;
          fVar169 = auVar108._0_4_;
          fVar220 = auVar108._4_4_;
          fVar221 = auVar108._8_4_;
          fVar222 = auVar108._12_4_;
          fVar168 = auVar108._16_4_;
          fVar181 = auVar108._20_4_;
          fVar80 = auVar108._24_4_;
          auVar46._4_4_ = fVar220 * fVar220 * fVar220 * auVar23._4_4_ * -0.5;
          auVar46._0_4_ = fVar169 * fVar169 * fVar169 * auVar23._0_4_ * -0.5;
          auVar46._8_4_ = fVar221 * fVar221 * fVar221 * auVar23._8_4_ * -0.5;
          auVar46._12_4_ = fVar222 * fVar222 * fVar222 * auVar23._12_4_ * -0.5;
          auVar46._16_4_ = fVar168 * fVar168 * fVar168 * -0.0;
          auVar46._20_4_ = fVar181 * fVar181 * fVar181 * -0.0;
          auVar46._24_4_ = fVar80 * fVar80 * fVar80 * -0.0;
          auVar46._28_4_ = auVar121._28_4_;
          auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar108 = vfmadd231ps_avx512vl(auVar46,auVar106,auVar108);
          auVar47._4_4_ = auVar121._4_4_ * auVar108._4_4_;
          auVar47._0_4_ = auVar121._0_4_ * auVar108._0_4_;
          auVar47._8_4_ = auVar121._8_4_ * auVar108._8_4_;
          auVar47._12_4_ = auVar121._12_4_ * auVar108._12_4_;
          auVar47._16_4_ = auVar121._16_4_ * auVar108._16_4_;
          auVar47._20_4_ = auVar121._20_4_ * auVar108._20_4_;
          auVar47._24_4_ = auVar121._24_4_ * auVar108._24_4_;
          auVar47._28_4_ = 0;
          auVar48._4_4_ = auVar108._4_4_ * -auVar120._4_4_;
          auVar48._0_4_ = auVar108._0_4_ * -auVar120._0_4_;
          auVar48._8_4_ = auVar108._8_4_ * -auVar120._8_4_;
          auVar48._12_4_ = auVar108._12_4_ * -auVar120._12_4_;
          auVar48._16_4_ = auVar108._16_4_ * -auVar120._16_4_;
          auVar48._20_4_ = auVar108._20_4_ * -auVar120._20_4_;
          auVar48._24_4_ = auVar108._24_4_ * -auVar120._24_4_;
          auVar48._28_4_ = auVar121._28_4_;
          auVar105 = vmulps_avx512vl(auVar108,ZEXT1632(auVar92));
          auVar95 = ZEXT1632(auVar92);
          auVar108 = vfmadd213ps_avx512vl(auVar122,auVar122,auVar95);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar123,auVar123);
          auVar104 = vrsqrt14ps_avx512vl(auVar108);
          auVar108 = vmulps_avx512vl(auVar108,auVar233);
          fVar169 = auVar104._0_4_;
          fVar220 = auVar104._4_4_;
          fVar221 = auVar104._8_4_;
          fVar222 = auVar104._12_4_;
          fVar168 = auVar104._16_4_;
          fVar181 = auVar104._20_4_;
          fVar80 = auVar104._24_4_;
          auVar49._4_4_ = fVar220 * fVar220 * fVar220 * auVar108._4_4_;
          auVar49._0_4_ = fVar169 * fVar169 * fVar169 * auVar108._0_4_;
          auVar49._8_4_ = fVar221 * fVar221 * fVar221 * auVar108._8_4_;
          auVar49._12_4_ = fVar222 * fVar222 * fVar222 * auVar108._12_4_;
          auVar49._16_4_ = fVar168 * fVar168 * fVar168 * auVar108._16_4_;
          auVar49._20_4_ = fVar181 * fVar181 * fVar181 * auVar108._20_4_;
          auVar49._24_4_ = fVar80 * fVar80 * fVar80 * auVar108._24_4_;
          auVar49._28_4_ = auVar108._28_4_;
          auVar108 = vfmadd231ps_avx512vl(auVar49,auVar106,auVar104);
          auVar50._4_4_ = auVar123._4_4_ * auVar108._4_4_;
          auVar50._0_4_ = auVar123._0_4_ * auVar108._0_4_;
          auVar50._8_4_ = auVar123._8_4_ * auVar108._8_4_;
          auVar50._12_4_ = auVar123._12_4_ * auVar108._12_4_;
          auVar50._16_4_ = auVar123._16_4_ * auVar108._16_4_;
          auVar50._20_4_ = auVar123._20_4_ * auVar108._20_4_;
          auVar50._24_4_ = auVar123._24_4_ * auVar108._24_4_;
          auVar50._28_4_ = auVar104._28_4_;
          auVar51._4_4_ = auVar108._4_4_ * auVar107._4_4_;
          auVar51._0_4_ = auVar108._0_4_ * auVar107._0_4_;
          auVar51._8_4_ = auVar108._8_4_ * auVar107._8_4_;
          auVar51._12_4_ = auVar108._12_4_ * auVar107._12_4_;
          auVar51._16_4_ = auVar108._16_4_ * auVar107._16_4_;
          auVar51._20_4_ = auVar108._20_4_ * auVar107._20_4_;
          auVar51._24_4_ = auVar108._24_4_ * auVar107._24_4_;
          auVar51._28_4_ = auVar107._28_4_;
          auVar107 = vmulps_avx512vl(auVar108,auVar95);
          auVar23 = vfmadd213ps_fma(auVar47,auVar96,ZEXT1632(auVar82));
          auVar24 = vfmadd213ps_fma(auVar48,auVar96,ZEXT1632(auVar83));
          auVar106 = vfmadd213ps_avx512vl(auVar105,auVar96,auVar94);
          auVar104 = vfmadd213ps_avx512vl(auVar50,auVar97,ZEXT1632(auVar89));
          auVar26 = vfnmadd213ps_fma(auVar47,auVar96,ZEXT1632(auVar82));
          auVar82 = vfmadd213ps_fma(auVar51,auVar97,ZEXT1632(auVar22));
          auVar27 = vfnmadd213ps_fma(auVar48,auVar96,ZEXT1632(auVar83));
          auVar83 = vfmadd213ps_fma(auVar107,auVar97,auVar93);
          auVar236 = vfnmadd231ps_fma(auVar94,auVar96,auVar105);
          auVar88 = vfnmadd213ps_fma(auVar50,auVar97,ZEXT1632(auVar89));
          auVar90 = vfnmadd213ps_fma(auVar51,auVar97,ZEXT1632(auVar22));
          auVar91 = vfnmadd231ps_fma(auVar93,auVar97,auVar107);
          auVar93 = vsubps_avx512vl(auVar104,ZEXT1632(auVar26));
          auVar107 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar27));
          auVar108 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar236));
          auVar52._4_4_ = auVar107._4_4_ * auVar236._4_4_;
          auVar52._0_4_ = auVar107._0_4_ * auVar236._0_4_;
          auVar52._8_4_ = auVar107._8_4_ * auVar236._8_4_;
          auVar52._12_4_ = auVar107._12_4_ * auVar236._12_4_;
          auVar52._16_4_ = auVar107._16_4_ * 0.0;
          auVar52._20_4_ = auVar107._20_4_ * 0.0;
          auVar52._24_4_ = auVar107._24_4_ * 0.0;
          auVar52._28_4_ = auVar105._28_4_;
          auVar89 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar27),auVar108);
          auVar53._4_4_ = auVar108._4_4_ * auVar26._4_4_;
          auVar53._0_4_ = auVar108._0_4_ * auVar26._0_4_;
          auVar53._8_4_ = auVar108._8_4_ * auVar26._8_4_;
          auVar53._12_4_ = auVar108._12_4_ * auVar26._12_4_;
          auVar53._16_4_ = auVar108._16_4_ * 0.0;
          auVar53._20_4_ = auVar108._20_4_ * 0.0;
          auVar53._24_4_ = auVar108._24_4_ * 0.0;
          auVar53._28_4_ = auVar108._28_4_;
          auVar22 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar236),auVar93);
          auVar54._4_4_ = auVar27._4_4_ * auVar93._4_4_;
          auVar54._0_4_ = auVar27._0_4_ * auVar93._0_4_;
          auVar54._8_4_ = auVar27._8_4_ * auVar93._8_4_;
          auVar54._12_4_ = auVar27._12_4_ * auVar93._12_4_;
          auVar54._16_4_ = auVar93._16_4_ * 0.0;
          auVar54._20_4_ = auVar93._20_4_ * 0.0;
          auVar54._24_4_ = auVar93._24_4_ * 0.0;
          auVar54._28_4_ = auVar93._28_4_;
          auVar25 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar26),auVar107);
          auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar25),auVar95,ZEXT1632(auVar22));
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar95,ZEXT1632(auVar89));
          auVar101 = ZEXT1632(auVar92);
          uVar70 = vcmpps_avx512vl(auVar107,auVar101,2);
          bVar69 = (byte)uVar70;
          fVar134 = (float)((uint)(bVar69 & 1) * auVar23._0_4_ |
                           (uint)!(bool)(bVar69 & 1) * auVar88._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          fVar136 = (float)((uint)bVar13 * auVar23._4_4_ | (uint)!bVar13 * auVar88._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          fVar139 = (float)((uint)bVar13 * auVar23._8_4_ | (uint)!bVar13 * auVar88._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          fVar140 = (float)((uint)bVar13 * auVar23._12_4_ | (uint)!bVar13 * auVar88._12_4_);
          auVar95 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar139,CONCAT44(fVar136,fVar134))));
          fVar135 = (float)((uint)(bVar69 & 1) * auVar24._0_4_ |
                           (uint)!(bool)(bVar69 & 1) * auVar90._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          fVar138 = (float)((uint)bVar13 * auVar24._4_4_ | (uint)!bVar13 * auVar90._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          fVar137 = (float)((uint)bVar13 * auVar24._8_4_ | (uint)!bVar13 * auVar90._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          fVar141 = (float)((uint)bVar13 * auVar24._12_4_ | (uint)!bVar13 * auVar90._12_4_);
          auVar98 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar137,CONCAT44(fVar138,fVar135))));
          auVar124._0_4_ =
               (float)((uint)(bVar69 & 1) * auVar106._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar91._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar91._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar91._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar91._12_4_)
          ;
          fVar220 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar106._16_4_);
          auVar124._16_4_ = fVar220;
          fVar221 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar106._20_4_);
          auVar124._20_4_ = fVar221;
          fVar169 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar106._24_4_);
          auVar124._24_4_ = fVar169;
          iVar1 = (uint)(byte)(uVar70 >> 7) * auVar106._28_4_;
          auVar124._28_4_ = iVar1;
          auVar107 = vblendmps_avx512vl(ZEXT1632(auVar26),auVar104);
          auVar125._0_4_ =
               (uint)(bVar69 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar89._0_4_;
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * auVar89._4_4_;
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * auVar89._8_4_;
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * auVar89._12_4_;
          auVar125._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar107._16_4_;
          auVar125._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar107._20_4_;
          auVar125._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar107._24_4_;
          auVar125._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar107._28_4_;
          auVar107 = vblendmps_avx512vl(ZEXT1632(auVar27),ZEXT1632(auVar82));
          auVar126._0_4_ =
               (float)((uint)(bVar69 & 1) * auVar107._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar23._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * auVar23._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * auVar23._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * auVar23._12_4_)
          ;
          fVar222 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar107._16_4_);
          auVar126._16_4_ = fVar222;
          fVar168 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar107._20_4_);
          auVar126._20_4_ = fVar168;
          fVar181 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar107._24_4_);
          auVar126._24_4_ = fVar181;
          auVar126._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar107._28_4_;
          auVar107 = vblendmps_avx512vl(ZEXT1632(auVar236),ZEXT1632(auVar83));
          auVar127._0_4_ =
               (float)((uint)(bVar69 & 1) * auVar107._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar24._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * auVar24._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * auVar24._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar127._12_4_ = (float)((uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * auVar24._12_4_)
          ;
          fVar133 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar107._16_4_);
          auVar127._16_4_ = fVar133;
          fVar80 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar107._20_4_);
          auVar127._20_4_ = fVar80;
          fVar81 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar107._24_4_);
          auVar127._24_4_ = fVar81;
          iVar2 = (uint)(byte)(uVar70 >> 7) * auVar107._28_4_;
          auVar127._28_4_ = iVar2;
          auVar128._0_4_ =
               (uint)(bVar69 & 1) * (int)auVar26._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar104._0_4_;
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar13 * (int)auVar26._4_4_ | (uint)!bVar13 * auVar104._4_4_;
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar13 * (int)auVar26._8_4_ | (uint)!bVar13 * auVar104._8_4_;
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar13 * (int)auVar26._12_4_ | (uint)!bVar13 * auVar104._12_4_;
          auVar128._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar104._16_4_;
          auVar128._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar104._20_4_;
          auVar128._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar104._24_4_;
          auVar128._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar104._28_4_;
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar70 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar104 = vsubps_avx512vl(auVar128,auVar95);
          auVar108 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar27._12_4_ |
                                                   (uint)!bVar17 * auVar82._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar27._8_4_ |
                                                            (uint)!bVar15 * auVar82._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar27._4_4_ |
                                                                     (uint)!bVar13 * auVar82._4_4_,
                                                                     (uint)(bVar69 & 1) *
                                                                     (int)auVar27._0_4_ |
                                                                     (uint)!(bool)(bVar69 & 1) *
                                                                     auVar82._0_4_)))),auVar98);
          auVar212 = ZEXT3264(auVar108);
          auVar106 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar236._12_4_ |
                                                   (uint)!bVar18 * auVar83._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar236._8_4_ |
                                                            (uint)!bVar16 * auVar83._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar236._4_4_ |
                                                                     (uint)!bVar14 * auVar83._4_4_,
                                                                     (uint)(bVar69 & 1) *
                                                                     (int)auVar236._0_4_ |
                                                                     (uint)!(bool)(bVar69 & 1) *
                                                                     auVar83._0_4_)))),auVar124);
          auVar105 = vsubps_avx(auVar95,auVar125);
          auVar217 = ZEXT3264(auVar105);
          auVar93 = vsubps_avx(auVar98,auVar126);
          auVar94 = vsubps_avx(auVar124,auVar127);
          auVar55._4_4_ = auVar106._4_4_ * fVar136;
          auVar55._0_4_ = auVar106._0_4_ * fVar134;
          auVar55._8_4_ = auVar106._8_4_ * fVar139;
          auVar55._12_4_ = auVar106._12_4_ * fVar140;
          auVar55._16_4_ = auVar106._16_4_ * 0.0;
          auVar55._20_4_ = auVar106._20_4_ * 0.0;
          auVar55._24_4_ = auVar106._24_4_ * 0.0;
          auVar55._28_4_ = 0;
          auVar82 = vfmsub231ps_fma(auVar55,auVar124,auVar104);
          auVar190._0_4_ = fVar135 * auVar104._0_4_;
          auVar190._4_4_ = fVar138 * auVar104._4_4_;
          auVar190._8_4_ = fVar137 * auVar104._8_4_;
          auVar190._12_4_ = fVar141 * auVar104._12_4_;
          auVar190._16_4_ = auVar104._16_4_ * 0.0;
          auVar190._20_4_ = auVar104._20_4_ * 0.0;
          auVar190._24_4_ = auVar104._24_4_ * 0.0;
          auVar190._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar190,auVar95,auVar108);
          auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar101,ZEXT1632(auVar82));
          auVar196._0_4_ = auVar108._0_4_ * auVar124._0_4_;
          auVar196._4_4_ = auVar108._4_4_ * auVar124._4_4_;
          auVar196._8_4_ = auVar108._8_4_ * auVar124._8_4_;
          auVar196._12_4_ = auVar108._12_4_ * auVar124._12_4_;
          auVar196._16_4_ = auVar108._16_4_ * fVar220;
          auVar196._20_4_ = auVar108._20_4_ * fVar221;
          auVar196._24_4_ = auVar108._24_4_ * fVar169;
          auVar196._28_4_ = 0;
          auVar82 = vfmsub231ps_fma(auVar196,auVar98,auVar106);
          auVar99 = vfmadd231ps_avx512vl(auVar107,auVar101,ZEXT1632(auVar82));
          auVar107 = vmulps_avx512vl(auVar94,auVar125);
          auVar107 = vfmsub231ps_avx512vl(auVar107,auVar105,auVar127);
          auVar56._4_4_ = auVar93._4_4_ * auVar127._4_4_;
          auVar56._0_4_ = auVar93._0_4_ * auVar127._0_4_;
          auVar56._8_4_ = auVar93._8_4_ * auVar127._8_4_;
          auVar56._12_4_ = auVar93._12_4_ * auVar127._12_4_;
          auVar56._16_4_ = auVar93._16_4_ * fVar133;
          auVar56._20_4_ = auVar93._20_4_ * fVar80;
          auVar56._24_4_ = auVar93._24_4_ * fVar81;
          auVar56._28_4_ = iVar2;
          auVar82 = vfmsub231ps_fma(auVar56,auVar126,auVar94);
          auVar197._0_4_ = auVar126._0_4_ * auVar105._0_4_;
          auVar197._4_4_ = auVar126._4_4_ * auVar105._4_4_;
          auVar197._8_4_ = auVar126._8_4_ * auVar105._8_4_;
          auVar197._12_4_ = auVar126._12_4_ * auVar105._12_4_;
          auVar197._16_4_ = fVar222 * auVar105._16_4_;
          auVar197._20_4_ = fVar168 * auVar105._20_4_;
          auVar197._24_4_ = fVar181 * auVar105._24_4_;
          auVar197._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar197,auVar93,auVar125);
          auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar101,auVar107);
          auVar100 = vfmadd231ps_avx512vl(auVar107,auVar101,ZEXT1632(auVar82));
          auVar200 = ZEXT3264(auVar100);
          auVar107 = vmaxps_avx(auVar99,auVar100);
          uVar162 = vcmpps_avx512vl(auVar107,auVar101,2);
          bVar78 = bVar78 & (byte)uVar162;
          if (bVar78 != 0) {
            uVar143 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar234._4_4_ = uVar143;
            auVar234._0_4_ = uVar143;
            auVar234._8_4_ = uVar143;
            auVar234._12_4_ = uVar143;
            auVar234._16_4_ = uVar143;
            auVar234._20_4_ = uVar143;
            auVar234._24_4_ = uVar143;
            auVar234._28_4_ = uVar143;
            auVar235 = ZEXT3264(auVar234);
            auVar57._4_4_ = auVar94._4_4_ * auVar108._4_4_;
            auVar57._0_4_ = auVar94._0_4_ * auVar108._0_4_;
            auVar57._8_4_ = auVar94._8_4_ * auVar108._8_4_;
            auVar57._12_4_ = auVar94._12_4_ * auVar108._12_4_;
            auVar57._16_4_ = auVar94._16_4_ * auVar108._16_4_;
            auVar57._20_4_ = auVar94._20_4_ * auVar108._20_4_;
            auVar57._24_4_ = auVar94._24_4_ * auVar108._24_4_;
            auVar57._28_4_ = auVar107._28_4_;
            auVar22 = vfmsub231ps_fma(auVar57,auVar93,auVar106);
            auVar58._4_4_ = auVar106._4_4_ * auVar105._4_4_;
            auVar58._0_4_ = auVar106._0_4_ * auVar105._0_4_;
            auVar58._8_4_ = auVar106._8_4_ * auVar105._8_4_;
            auVar58._12_4_ = auVar106._12_4_ * auVar105._12_4_;
            auVar58._16_4_ = auVar106._16_4_ * auVar105._16_4_;
            auVar58._20_4_ = auVar106._20_4_ * auVar105._20_4_;
            auVar58._24_4_ = auVar106._24_4_ * auVar105._24_4_;
            auVar58._28_4_ = auVar106._28_4_;
            auVar89 = vfmsub231ps_fma(auVar58,auVar104,auVar94);
            auVar59._4_4_ = auVar93._4_4_ * auVar104._4_4_;
            auVar59._0_4_ = auVar93._0_4_ * auVar104._0_4_;
            auVar59._8_4_ = auVar93._8_4_ * auVar104._8_4_;
            auVar59._12_4_ = auVar93._12_4_ * auVar104._12_4_;
            auVar59._16_4_ = auVar93._16_4_ * auVar104._16_4_;
            auVar59._20_4_ = auVar93._20_4_ * auVar104._20_4_;
            auVar59._24_4_ = auVar93._24_4_ * auVar104._24_4_;
            auVar59._28_4_ = auVar93._28_4_;
            auVar23 = vfmsub231ps_fma(auVar59,auVar105,auVar108);
            auVar82 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar23));
            auVar83 = vfmadd231ps_fma(ZEXT1632(auVar82),ZEXT1632(auVar22),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar107 = vrcp14ps_avx512vl(ZEXT1632(auVar83));
            auVar34._8_4_ = 0x3f800000;
            auVar34._0_8_ = 0x3f8000003f800000;
            auVar34._12_4_ = 0x3f800000;
            auVar34._16_4_ = 0x3f800000;
            auVar34._20_4_ = 0x3f800000;
            auVar34._24_4_ = 0x3f800000;
            auVar34._28_4_ = 0x3f800000;
            auVar108 = vfnmadd213ps_avx512vl(auVar107,ZEXT1632(auVar83),auVar34);
            auVar82 = vfmadd132ps_fma(auVar108,auVar107,auVar107);
            auVar212 = ZEXT1664(auVar82);
            auVar60._4_4_ = auVar23._4_4_ * auVar124._4_4_;
            auVar60._0_4_ = auVar23._0_4_ * auVar124._0_4_;
            auVar60._8_4_ = auVar23._8_4_ * auVar124._8_4_;
            auVar60._12_4_ = auVar23._12_4_ * auVar124._12_4_;
            auVar60._16_4_ = fVar220 * 0.0;
            auVar60._20_4_ = fVar221 * 0.0;
            auVar60._24_4_ = fVar169 * 0.0;
            auVar60._28_4_ = iVar1;
            auVar89 = vfmadd231ps_fma(auVar60,auVar98,ZEXT1632(auVar89));
            auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar95,ZEXT1632(auVar22));
            fVar169 = auVar82._0_4_;
            fVar220 = auVar82._4_4_;
            fVar221 = auVar82._8_4_;
            fVar222 = auVar82._12_4_;
            local_5e0._28_4_ = auVar107._28_4_;
            local_5e0._0_28_ =
                 ZEXT1628(CONCAT412(auVar89._12_4_ * fVar222,
                                    CONCAT48(auVar89._8_4_ * fVar221,
                                             CONCAT44(auVar89._4_4_ * fVar220,
                                                      auVar89._0_4_ * fVar169))));
            auVar217 = ZEXT3264(local_5e0);
            uVar162 = vcmpps_avx512vl(local_5e0,auVar234,2);
            auVar67._4_4_ = uStack_55c;
            auVar67._0_4_ = local_560;
            auVar67._8_4_ = uStack_558;
            auVar67._12_4_ = uStack_554;
            auVar67._16_4_ = uStack_550;
            auVar67._20_4_ = uStack_54c;
            auVar67._24_4_ = uStack_548;
            auVar67._28_4_ = uStack_544;
            uVar28 = vcmpps_avx512vl(local_5e0,auVar67,0xd);
            bVar78 = (byte)uVar162 & (byte)uVar28 & bVar78;
            if (bVar78 != 0) {
              uVar79 = vcmpps_avx512vl(ZEXT1632(auVar83),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar79 = bVar78 & uVar79;
              if ((char)uVar79 != '\0') {
                fVar168 = auVar99._0_4_ * fVar169;
                fVar181 = auVar99._4_4_ * fVar220;
                auVar61._4_4_ = fVar181;
                auVar61._0_4_ = fVar168;
                fVar80 = auVar99._8_4_ * fVar221;
                auVar61._8_4_ = fVar80;
                fVar81 = auVar99._12_4_ * fVar222;
                auVar61._12_4_ = fVar81;
                fVar133 = auVar99._16_4_ * 0.0;
                auVar61._16_4_ = fVar133;
                fVar134 = auVar99._20_4_ * 0.0;
                auVar61._20_4_ = fVar134;
                fVar135 = auVar99._24_4_ * 0.0;
                auVar61._24_4_ = fVar135;
                auVar61._28_4_ = auVar99._28_4_;
                auVar180._8_4_ = 0x3f800000;
                auVar180._0_8_ = 0x3f8000003f800000;
                auVar180._12_4_ = 0x3f800000;
                auVar180._16_4_ = 0x3f800000;
                auVar180._20_4_ = 0x3f800000;
                auVar180._24_4_ = 0x3f800000;
                auVar180._28_4_ = 0x3f800000;
                auVar107 = vsubps_avx(auVar180,auVar61);
                local_400._0_4_ =
                     (float)((uint)(bVar69 & 1) * (int)fVar168 |
                            (uint)!(bool)(bVar69 & 1) * auVar107._0_4_);
                bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
                local_400._4_4_ =
                     (float)((uint)bVar13 * (int)fVar181 | (uint)!bVar13 * auVar107._4_4_);
                bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
                local_400._8_4_ =
                     (float)((uint)bVar13 * (int)fVar80 | (uint)!bVar13 * auVar107._8_4_);
                bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
                local_400._12_4_ =
                     (float)((uint)bVar13 * (int)fVar81 | (uint)!bVar13 * auVar107._12_4_);
                bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
                local_400._16_4_ =
                     (float)((uint)bVar13 * (int)fVar133 | (uint)!bVar13 * auVar107._16_4_);
                bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
                local_400._20_4_ =
                     (float)((uint)bVar13 * (int)fVar134 | (uint)!bVar13 * auVar107._20_4_);
                bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
                local_400._24_4_ =
                     (float)((uint)bVar13 * (int)fVar135 | (uint)!bVar13 * auVar107._24_4_);
                bVar13 = SUB81(uVar70 >> 7,0);
                local_400._28_4_ =
                     (float)((uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar107._28_4_);
                auVar107 = vsubps_avx(auVar97,auVar96);
                auVar82 = vfmadd213ps_fma(auVar107,local_400,auVar96);
                uVar143 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar35._4_4_ = uVar143;
                auVar35._0_4_ = uVar143;
                auVar35._8_4_ = uVar143;
                auVar35._12_4_ = uVar143;
                auVar35._16_4_ = uVar143;
                auVar35._20_4_ = uVar143;
                auVar35._24_4_ = uVar143;
                auVar35._28_4_ = uVar143;
                auVar107 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                              CONCAT48(auVar82._8_4_ + auVar82._8_4_
                                                                       ,CONCAT44(auVar82._4_4_ +
                                                                                 auVar82._4_4_,
                                                                                 auVar82._0_4_ +
                                                                                 auVar82._0_4_)))),
                                           auVar35);
                uVar29 = vcmpps_avx512vl(local_5e0,auVar107,6);
                uVar79 = uVar79 & uVar29;
                bVar78 = (byte)uVar79;
                if (bVar78 != 0) {
                  auVar167._0_4_ = auVar100._0_4_ * fVar169;
                  auVar167._4_4_ = auVar100._4_4_ * fVar220;
                  auVar167._8_4_ = auVar100._8_4_ * fVar221;
                  auVar167._12_4_ = auVar100._12_4_ * fVar222;
                  auVar167._16_4_ = auVar100._16_4_ * 0.0;
                  auVar167._20_4_ = auVar100._20_4_ * 0.0;
                  auVar167._24_4_ = auVar100._24_4_ * 0.0;
                  auVar167._28_4_ = 0;
                  auVar191._8_4_ = 0x3f800000;
                  auVar191._0_8_ = 0x3f8000003f800000;
                  auVar191._12_4_ = 0x3f800000;
                  auVar191._16_4_ = 0x3f800000;
                  auVar191._20_4_ = 0x3f800000;
                  auVar191._24_4_ = 0x3f800000;
                  auVar191._28_4_ = 0x3f800000;
                  auVar107 = vsubps_avx(auVar191,auVar167);
                  auVar129._0_4_ =
                       (uint)(bVar69 & 1) * (int)auVar167._0_4_ |
                       (uint)!(bool)(bVar69 & 1) * auVar107._0_4_;
                  bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
                  auVar129._4_4_ =
                       (uint)bVar13 * (int)auVar167._4_4_ | (uint)!bVar13 * auVar107._4_4_;
                  bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
                  auVar129._8_4_ =
                       (uint)bVar13 * (int)auVar167._8_4_ | (uint)!bVar13 * auVar107._8_4_;
                  bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
                  auVar129._12_4_ =
                       (uint)bVar13 * (int)auVar167._12_4_ | (uint)!bVar13 * auVar107._12_4_;
                  bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
                  auVar129._16_4_ =
                       (uint)bVar13 * (int)auVar167._16_4_ | (uint)!bVar13 * auVar107._16_4_;
                  bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
                  auVar129._20_4_ =
                       (uint)bVar13 * (int)auVar167._20_4_ | (uint)!bVar13 * auVar107._20_4_;
                  bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
                  auVar129._24_4_ =
                       (uint)bVar13 * (int)auVar167._24_4_ | (uint)!bVar13 * auVar107._24_4_;
                  auVar129._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar107._28_4_;
                  auVar36._8_4_ = 0x40000000;
                  auVar36._0_8_ = 0x4000000040000000;
                  auVar36._12_4_ = 0x40000000;
                  auVar36._16_4_ = 0x40000000;
                  auVar36._20_4_ = 0x40000000;
                  auVar36._24_4_ = 0x40000000;
                  auVar36._28_4_ = 0x40000000;
                  local_3e0 = vfmsub132ps_avx512vl(auVar129,auVar191,auVar36);
                  local_3a0 = (undefined4)lVar73;
                  local_390 = local_670;
                  uStack_388 = uStack_668;
                  local_380 = local_680;
                  uStack_378 = uStack_678;
                  local_370 = local_690;
                  uStack_368 = uStack_688;
                  local_360 = local_6a0;
                  uStack_358 = uStack_698;
                  pGVar75 = (context->scene->geometries).items[uVar76].ptr;
                  if ((pGVar75->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    auVar82 = vcvtsi2ss_avx512f(auVar92,local_3a0);
                    fVar169 = auVar82._0_4_;
                    local_340[0] = (fVar169 + local_400._0_4_ + 0.0) * local_100;
                    local_340[1] = (fVar169 + local_400._4_4_ + 1.0) * fStack_fc;
                    local_340[2] = (fVar169 + local_400._8_4_ + 2.0) * fStack_f8;
                    local_340[3] = (fVar169 + local_400._12_4_ + 3.0) * fStack_f4;
                    fStack_330 = (fVar169 + local_400._16_4_ + 4.0) * fStack_f0;
                    fStack_32c = (fVar169 + local_400._20_4_ + 5.0) * fStack_ec;
                    fStack_328 = (fVar169 + local_400._24_4_ + 6.0) * fStack_e8;
                    fStack_324 = fVar169 + local_400._28_4_ + 7.0;
                    local_320 = local_3e0;
                    local_300 = local_5e0;
                    auVar154._8_4_ = 0x7f800000;
                    auVar154._0_8_ = 0x7f8000007f800000;
                    auVar154._12_4_ = 0x7f800000;
                    auVar154._16_4_ = 0x7f800000;
                    auVar154._20_4_ = 0x7f800000;
                    auVar154._24_4_ = 0x7f800000;
                    auVar154._28_4_ = 0x7f800000;
                    auVar107 = vblendmps_avx512vl(auVar154,local_5e0);
                    auVar130._0_4_ =
                         (uint)(bVar78 & 1) * auVar107._0_4_ |
                         (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar79 >> 1) & 1);
                    auVar130._4_4_ = (uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar79 >> 2) & 1);
                    auVar130._8_4_ = (uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar79 >> 3) & 1);
                    auVar130._12_4_ = (uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar79 >> 4) & 1);
                    auVar130._16_4_ = (uint)bVar13 * auVar107._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar79 >> 5) & 1);
                    auVar130._20_4_ = (uint)bVar13 * auVar107._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar79 >> 6) & 1);
                    auVar130._24_4_ = (uint)bVar13 * auVar107._24_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = SUB81(uVar79 >> 7,0);
                    auVar130._28_4_ = (uint)bVar13 * auVar107._28_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar107 = vshufps_avx(auVar130,auVar130,0xb1);
                    auVar107 = vminps_avx(auVar130,auVar107);
                    auVar108 = vshufpd_avx(auVar107,auVar107,5);
                    auVar107 = vminps_avx(auVar107,auVar108);
                    auVar108 = vpermpd_avx2(auVar107,0x4e);
                    auVar107 = vminps_avx(auVar107,auVar108);
                    uVar162 = vcmpps_avx512vl(auVar130,auVar107,0);
                    uVar71 = (uint)uVar79;
                    if (((byte)uVar162 & bVar78) != 0) {
                      uVar71 = (uint)((byte)uVar162 & bVar78);
                    }
                    uVar72 = 0;
                    for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                      uVar72 = uVar72 + 1;
                    }
                    uVar70 = (ulong)uVar72;
                    pGVar68 = pGVar75;
                    local_3c0 = local_5e0;
                    local_39c = iVar8;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      do {
                        local_630 = pGVar68;
                        local_1c0 = local_340[uVar70];
                        local_1a0 = *(undefined4 *)(local_320 + uVar70 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_300 + uVar70 * 4);
                        local_660.context = context->user;
                        fVar220 = 1.0 - local_1c0;
                        fVar169 = fVar220 * fVar220 * -3.0;
                        auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar220 * fVar220)),
                                                  ZEXT416((uint)(local_1c0 * fVar220)),
                                                  ZEXT416(0xc0000000));
                        auVar83 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar220)),
                                                  ZEXT416((uint)(local_1c0 * local_1c0)),
                                                  ZEXT416(0x40000000));
                        fVar220 = auVar82._0_4_ * 3.0;
                        fVar221 = auVar83._0_4_ * 3.0;
                        fVar222 = local_1c0 * local_1c0 * 3.0;
                        auVar206._0_4_ = fVar222 * fVar142;
                        auVar206._4_4_ = fVar222 * fVar159;
                        auVar206._8_4_ = fVar222 * fVar160;
                        auVar206._12_4_ = fVar222 * fVar161;
                        auVar147._4_4_ = fVar221;
                        auVar147._0_4_ = fVar221;
                        auVar147._8_4_ = fVar221;
                        auVar147._12_4_ = fVar221;
                        auVar82 = vfmadd132ps_fma(auVar147,auVar206,auVar87);
                        auVar187._4_4_ = fVar220;
                        auVar187._0_4_ = fVar220;
                        auVar187._8_4_ = fVar220;
                        auVar187._12_4_ = fVar220;
                        auVar82 = vfmadd132ps_fma(auVar187,auVar82,auVar21);
                        auVar148._4_4_ = fVar169;
                        auVar148._0_4_ = fVar169;
                        auVar148._8_4_ = fVar169;
                        auVar148._12_4_ = fVar169;
                        auVar82 = vfmadd132ps_fma(auVar148,auVar82,auVar20);
                        local_220 = auVar82._0_4_;
                        auVar198._8_4_ = 1;
                        auVar198._0_8_ = 0x100000001;
                        auVar198._12_4_ = 1;
                        auVar198._16_4_ = 1;
                        auVar198._20_4_ = 1;
                        auVar198._24_4_ = 1;
                        auVar198._28_4_ = 1;
                        local_200 = vpermps_avx2(auVar198,ZEXT1632(auVar82));
                        auVar200 = ZEXT3264(local_200);
                        auVar207._8_4_ = 2;
                        auVar207._0_8_ = 0x200000002;
                        auVar207._12_4_ = 2;
                        auVar210._16_4_ = 2;
                        auVar210._0_16_ = auVar207;
                        auVar210._20_4_ = 2;
                        auVar210._24_4_ = 2;
                        auVar210._28_4_ = 2;
                        auVar212 = ZEXT3264(auVar210);
                        local_1e0 = vpermps_avx2(auVar210,ZEXT1632(auVar82));
                        iStack_21c = local_220;
                        iStack_218 = local_220;
                        iStack_214 = local_220;
                        iStack_210 = local_220;
                        iStack_20c = local_220;
                        iStack_208 = local_220;
                        iStack_204 = local_220;
                        fStack_1bc = local_1c0;
                        fStack_1b8 = local_1c0;
                        fStack_1b4 = local_1c0;
                        fStack_1b0 = local_1c0;
                        fStack_1ac = local_1c0;
                        fStack_1a8 = local_1c0;
                        fStack_1a4 = local_1c0;
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = local_540._0_8_;
                        uStack_178 = local_540._8_8_;
                        uStack_170 = local_540._16_8_;
                        uStack_168 = local_540._24_8_;
                        local_160 = local_580;
                        auVar107 = vpcmpeqd_avx2(local_580,local_580);
                        local_628[1] = auVar107;
                        *local_628 = auVar107;
                        local_140 = (local_660.context)->instID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_120 = (local_660.context)->instPrimID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_620 = local_2c0;
                        local_660.valid = (int *)local_620;
                        local_660.geometryUserPtr = pGVar75->userPtr;
                        local_660.hit = (RTCHitN *)&local_220;
                        local_660.N = 8;
                        local_5c0 = auVar235._0_32_;
                        local_660.ray = (RTCRayN *)ray;
                        if (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar200 = ZEXT1664(local_200._0_16_);
                          auVar212 = ZEXT1664(auVar207);
                          (*pGVar75->intersectionFilterN)(&local_660);
                          auVar217 = ZEXT3264(local_5e0);
                          auVar235 = ZEXT3264(local_5c0);
                          pGVar75 = local_630;
                        }
                        if (local_620 == (undefined1  [32])0x0) {
LAB_01b809a9:
                          *(int *)(ray + k * 4 + 0x100) = auVar235._0_4_;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar75->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar200 = ZEXT1664(auVar200._0_16_);
                            auVar212 = ZEXT1664(auVar212._0_16_);
                            (*p_Var12)(&local_660);
                            auVar217 = ZEXT3264(local_5e0);
                            auVar235 = ZEXT3264(local_5c0);
                            pGVar75 = local_630;
                          }
                          if (local_620 == (undefined1  [32])0x0) goto LAB_01b809a9;
                          uVar29 = vptestmd_avx512vl(local_620,local_620);
                          iVar1 = *(int *)(local_660.hit + 4);
                          iVar2 = *(int *)(local_660.hit + 8);
                          iVar62 = *(int *)(local_660.hit + 0xc);
                          iVar63 = *(int *)(local_660.hit + 0x10);
                          iVar64 = *(int *)(local_660.hit + 0x14);
                          iVar65 = *(int *)(local_660.hit + 0x18);
                          iVar66 = *(int *)(local_660.hit + 0x1c);
                          bVar78 = (byte)uVar29;
                          bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar19 = SUB81(uVar29 >> 7,0);
                          *(uint *)(local_660.ray + 0x180) =
                               (uint)(bVar78 & 1) * *(int *)local_660.hit |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_660.ray + 0x180);
                          *(uint *)(local_660.ray + 0x184) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x184);
                          *(uint *)(local_660.ray + 0x188) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x188);
                          *(uint *)(local_660.ray + 0x18c) =
                               (uint)bVar15 * iVar62 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x18c);
                          *(uint *)(local_660.ray + 400) =
                               (uint)bVar16 * iVar63 | (uint)!bVar16 * *(int *)(local_660.ray + 400)
                          ;
                          *(uint *)(local_660.ray + 0x194) =
                               (uint)bVar17 * iVar64 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x194);
                          *(uint *)(local_660.ray + 0x198) =
                               (uint)bVar18 * iVar65 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x198);
                          *(uint *)(local_660.ray + 0x19c) =
                               (uint)bVar19 * iVar66 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x19c);
                          iVar1 = *(int *)(local_660.hit + 0x24);
                          iVar2 = *(int *)(local_660.hit + 0x28);
                          iVar62 = *(int *)(local_660.hit + 0x2c);
                          iVar63 = *(int *)(local_660.hit + 0x30);
                          iVar64 = *(int *)(local_660.hit + 0x34);
                          iVar65 = *(int *)(local_660.hit + 0x38);
                          iVar66 = *(int *)(local_660.hit + 0x3c);
                          bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar19 = SUB81(uVar29 >> 7,0);
                          *(uint *)(local_660.ray + 0x1a0) =
                               (uint)(bVar78 & 1) * *(int *)(local_660.hit + 0x20) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_660.ray + 0x1a0);
                          *(uint *)(local_660.ray + 0x1a4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x1a4);
                          *(uint *)(local_660.ray + 0x1a8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x1a8);
                          *(uint *)(local_660.ray + 0x1ac) =
                               (uint)bVar15 * iVar62 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x1ac);
                          *(uint *)(local_660.ray + 0x1b0) =
                               (uint)bVar16 * iVar63 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x1b0);
                          *(uint *)(local_660.ray + 0x1b4) =
                               (uint)bVar17 * iVar64 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x1b4);
                          *(uint *)(local_660.ray + 0x1b8) =
                               (uint)bVar18 * iVar65 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x1b8);
                          *(uint *)(local_660.ray + 0x1bc) =
                               (uint)bVar19 * iVar66 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x1bc);
                          iVar1 = *(int *)(local_660.hit + 0x44);
                          iVar2 = *(int *)(local_660.hit + 0x48);
                          iVar62 = *(int *)(local_660.hit + 0x4c);
                          iVar63 = *(int *)(local_660.hit + 0x50);
                          iVar64 = *(int *)(local_660.hit + 0x54);
                          iVar65 = *(int *)(local_660.hit + 0x58);
                          iVar66 = *(int *)(local_660.hit + 0x5c);
                          bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar19 = SUB81(uVar29 >> 7,0);
                          *(uint *)(local_660.ray + 0x1c0) =
                               (uint)(bVar78 & 1) * *(int *)(local_660.hit + 0x40) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_660.ray + 0x1c0);
                          *(uint *)(local_660.ray + 0x1c4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x1c4);
                          *(uint *)(local_660.ray + 0x1c8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x1c8);
                          *(uint *)(local_660.ray + 0x1cc) =
                               (uint)bVar15 * iVar62 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x1cc);
                          *(uint *)(local_660.ray + 0x1d0) =
                               (uint)bVar16 * iVar63 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x1d0);
                          *(uint *)(local_660.ray + 0x1d4) =
                               (uint)bVar17 * iVar64 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x1d4);
                          *(uint *)(local_660.ray + 0x1d8) =
                               (uint)bVar18 * iVar65 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x1d8);
                          *(uint *)(local_660.ray + 0x1dc) =
                               (uint)bVar19 * iVar66 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x1dc);
                          iVar1 = *(int *)(local_660.hit + 100);
                          iVar2 = *(int *)(local_660.hit + 0x68);
                          iVar62 = *(int *)(local_660.hit + 0x6c);
                          iVar63 = *(int *)(local_660.hit + 0x70);
                          iVar64 = *(int *)(local_660.hit + 0x74);
                          iVar65 = *(int *)(local_660.hit + 0x78);
                          iVar66 = *(int *)(local_660.hit + 0x7c);
                          bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar19 = SUB81(uVar29 >> 7,0);
                          *(uint *)(local_660.ray + 0x1e0) =
                               (uint)(bVar78 & 1) * *(int *)(local_660.hit + 0x60) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_660.ray + 0x1e0);
                          *(uint *)(local_660.ray + 0x1e4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x1e4);
                          *(uint *)(local_660.ray + 0x1e8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x1e8);
                          *(uint *)(local_660.ray + 0x1ec) =
                               (uint)bVar15 * iVar62 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x1ec);
                          *(uint *)(local_660.ray + 0x1f0) =
                               (uint)bVar16 * iVar63 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x1f0);
                          *(uint *)(local_660.ray + 500) =
                               (uint)bVar17 * iVar64 | (uint)!bVar17 * *(int *)(local_660.ray + 500)
                          ;
                          *(uint *)(local_660.ray + 0x1f8) =
                               (uint)bVar18 * iVar65 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x1f8);
                          *(uint *)(local_660.ray + 0x1fc) =
                               (uint)bVar19 * iVar66 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x1fc);
                          iVar1 = *(int *)(local_660.hit + 0x84);
                          iVar2 = *(int *)(local_660.hit + 0x88);
                          iVar62 = *(int *)(local_660.hit + 0x8c);
                          iVar63 = *(int *)(local_660.hit + 0x90);
                          iVar64 = *(int *)(local_660.hit + 0x94);
                          iVar65 = *(int *)(local_660.hit + 0x98);
                          iVar66 = *(int *)(local_660.hit + 0x9c);
                          bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar19 = SUB81(uVar29 >> 7,0);
                          *(uint *)(local_660.ray + 0x200) =
                               (uint)(bVar78 & 1) * *(int *)(local_660.hit + 0x80) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_660.ray + 0x200);
                          *(uint *)(local_660.ray + 0x204) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x204);
                          *(uint *)(local_660.ray + 0x208) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x208);
                          *(uint *)(local_660.ray + 0x20c) =
                               (uint)bVar15 * iVar62 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x20c);
                          *(uint *)(local_660.ray + 0x210) =
                               (uint)bVar16 * iVar63 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x210);
                          *(uint *)(local_660.ray + 0x214) =
                               (uint)bVar17 * iVar64 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x214);
                          *(uint *)(local_660.ray + 0x218) =
                               (uint)bVar18 * iVar65 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x218);
                          *(uint *)(local_660.ray + 0x21c) =
                               (uint)bVar19 * iVar66 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x21c);
                          auVar107 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x220) = auVar107;
                          auVar107 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x240) = auVar107;
                          auVar107 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x260) = auVar107;
                          auVar107 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_660.hit + 0x100));
                          *(undefined1 (*) [32])(local_660.ray + 0x280) = auVar107;
                          auVar235 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                        }
                        bVar78 = ~(byte)(1 << ((uint)uVar70 & 0x1f)) & (byte)uVar79;
                        uVar143 = auVar235._0_4_;
                        auVar155._4_4_ = uVar143;
                        auVar155._0_4_ = uVar143;
                        auVar155._8_4_ = uVar143;
                        auVar155._12_4_ = uVar143;
                        auVar155._16_4_ = uVar143;
                        auVar155._20_4_ = uVar143;
                        auVar155._24_4_ = uVar143;
                        auVar155._28_4_ = uVar143;
                        uVar162 = vcmpps_avx512vl(auVar217._0_32_,auVar155,2);
                        if ((bVar78 & (byte)uVar162) == 0) goto LAB_01b80a38;
                        bVar78 = bVar78 & (byte)uVar162;
                        uVar79 = (ulong)bVar78;
                        auVar156._8_4_ = 0x7f800000;
                        auVar156._0_8_ = 0x7f8000007f800000;
                        auVar156._12_4_ = 0x7f800000;
                        auVar156._16_4_ = 0x7f800000;
                        auVar156._20_4_ = 0x7f800000;
                        auVar156._24_4_ = 0x7f800000;
                        auVar156._28_4_ = 0x7f800000;
                        auVar107 = vblendmps_avx512vl(auVar156,auVar217._0_32_);
                        auVar131._0_4_ =
                             (uint)(bVar78 & 1) * auVar107._0_4_ |
                             (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar78 >> 1 & 1);
                        auVar131._4_4_ = (uint)bVar13 * auVar107._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar78 >> 2 & 1);
                        auVar131._8_4_ = (uint)bVar13 * auVar107._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar78 >> 3 & 1);
                        auVar131._12_4_ =
                             (uint)bVar13 * auVar107._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar78 >> 4 & 1);
                        auVar131._16_4_ =
                             (uint)bVar13 * auVar107._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar78 >> 5 & 1);
                        auVar131._20_4_ =
                             (uint)bVar13 * auVar107._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar78 >> 6 & 1);
                        auVar131._24_4_ =
                             (uint)bVar13 * auVar107._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar131._28_4_ =
                             (uint)(bVar78 >> 7) * auVar107._28_4_ |
                             (uint)!(bool)(bVar78 >> 7) * 0x7f800000;
                        auVar107 = vshufps_avx(auVar131,auVar131,0xb1);
                        auVar107 = vminps_avx(auVar131,auVar107);
                        auVar108 = vshufpd_avx(auVar107,auVar107,5);
                        auVar107 = vminps_avx(auVar107,auVar108);
                        auVar108 = vpermpd_avx2(auVar107,0x4e);
                        auVar107 = vminps_avx(auVar107,auVar108);
                        uVar162 = vcmpps_avx512vl(auVar131,auVar107,0);
                        bVar69 = (byte)uVar162 & bVar78;
                        if (bVar69 != 0) {
                          bVar78 = bVar69;
                        }
                        uVar71 = 0;
                        for (uVar72 = (uint)bVar78; (uVar72 & 1) == 0;
                            uVar72 = uVar72 >> 1 | 0x80000000) {
                          uVar71 = uVar71 + 1;
                        }
                        uVar70 = (ulong)uVar71;
                        pGVar68 = local_630;
                      } while( true );
                    }
                    fVar169 = local_340[uVar70];
                    uVar143 = *(undefined4 *)(local_320 + uVar70 * 4);
                    fVar221 = 1.0 - fVar169;
                    fVar220 = fVar221 * fVar221 * -3.0;
                    auVar200 = ZEXT464((uint)fVar220);
                    auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar221 * fVar221)),
                                              ZEXT416((uint)(fVar169 * fVar221)),ZEXT416(0xc0000000)
                                             );
                    auVar83 = vfmsub132ss_fma(ZEXT416((uint)(fVar169 * fVar221)),
                                              ZEXT416((uint)(fVar169 * fVar169)),ZEXT416(0x40000000)
                                             );
                    fVar221 = auVar82._0_4_ * 3.0;
                    fVar222 = auVar83._0_4_ * 3.0;
                    fVar168 = fVar169 * fVar169 * 3.0;
                    auVar205._0_4_ = fVar168 * fVar142;
                    auVar205._4_4_ = fVar168 * fVar159;
                    auVar205._8_4_ = fVar168 * fVar160;
                    auVar205._12_4_ = fVar168 * fVar161;
                    auVar212 = ZEXT1664(auVar205);
                    auVar177._4_4_ = fVar222;
                    auVar177._0_4_ = fVar222;
                    auVar177._8_4_ = fVar222;
                    auVar177._12_4_ = fVar222;
                    auVar82 = vfmadd132ps_fma(auVar177,auVar205,auVar87);
                    auVar186._4_4_ = fVar221;
                    auVar186._0_4_ = fVar221;
                    auVar186._8_4_ = fVar221;
                    auVar186._12_4_ = fVar221;
                    auVar82 = vfmadd132ps_fma(auVar186,auVar82,auVar21);
                    auVar178._4_4_ = fVar220;
                    auVar178._0_4_ = fVar220;
                    auVar178._8_4_ = fVar220;
                    auVar178._12_4_ = fVar220;
                    auVar82 = vfmadd132ps_fma(auVar178,auVar82,auVar20);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar70 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar82._0_4_;
                    uVar9 = vextractps_avx(auVar82,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                    uVar9 = vextractps_avx(auVar82,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar9;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar169;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar143;
                    *(uint *)(ray + k * 4 + 0x220) = uVar7;
                    *(uint *)(ray + k * 4 + 0x240) = uVar76;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01b8068f;
      }
LAB_01b7fd17:
      uVar143 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar31._4_4_ = uVar143;
      auVar31._0_4_ = uVar143;
      auVar31._8_4_ = uVar143;
      auVar31._12_4_ = uVar143;
      uVar162 = vcmpps_avx512vl(local_2d0,auVar31,2);
      uVar76 = (uint)uVar77 & (uint)uVar77 + 0xf & (uint)uVar162;
      uVar77 = (ulong)uVar76;
    } while (uVar76 != 0);
  }
  return;
LAB_01b80a38:
  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar237 = ZEXT1664(auVar82);
  auVar238 = ZEXT464(0xbf800000);
LAB_01b8068f:
  lVar73 = lVar73 + 8;
  if (iVar8 <= (int)lVar73) goto LAB_01b7fd17;
  goto LAB_01b7fdc8;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }